

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_temporal_filter_sse2.c
# Opt level: O0

void highbd_apply_temporal_filter
               (uint16_t *frame1,uint stride,uint16_t *frame2,uint stride2,int block_width,
               int block_height,int *subblock_mses,uint *accumulator,uint16_t *count,
               uint32_t *frame_sse,uint32_t *luma_sse_sum,int bd,double inv_num_ref_pixels,
               double decay_factor,double inv_factor,double weight_factor,double *d_factor,
               int tf_wgt_calc_lvl)

{
  ushort uVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  int iVar23;
  long lVar24;
  uint in_ECX;
  int iVar25;
  long lVar26;
  undefined1 (*in_RDX) [32];
  uint in_ESI;
  undefined1 (*in_RDI) [32];
  int in_R8D;
  int in_R9D;
  double in_XMM0_Qa;
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar32 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  long in_stack_00000008;
  undefined4 in_stack_0000003c;
  uint32_t diff_sse_1;
  int pixel_value_1;
  int j_1;
  int y_blk_raster_offset_1;
  int k_1;
  int i_12;
  int weight;
  double scaled_error;
  double combined_error;
  int subblock_idx;
  double window_error;
  uint32_t diff_sse;
  int pixel_value;
  int j;
  int y_blk_raster_offset;
  int k;
  int i_11;
  int idx;
  double d_factor_decayed [4];
  double subblock_mses_scaled [4];
  int i_10;
  __m256i vsum_5;
  __m256i vsum3_5;
  __m256i vsum2_5;
  __m256i vsum1_5;
  int row_5;
  int i_9;
  __m256i vsum_4;
  __m256i vsum3_4;
  __m256i vsum2_4;
  __m256i vsum1_4;
  int row_4;
  int i_8;
  int i_7;
  __m256i vsum_3;
  __m256i vsum3_3;
  __m256i vsum2_3;
  __m256i vsum1_3;
  int row_3;
  int i_6;
  __m256i vsum_2;
  __m256i vsum3_2;
  __m256i vsum2_2;
  __m256i vsum1_2;
  int row_2;
  int i_5;
  int i_4;
  __m256i vsum_1;
  __m256i vsum3_1;
  __m256i vsum2_1;
  __m256i vsum1_1;
  int row_1;
  int i_3;
  __m256i vsum;
  __m256i vsum3;
  __m256i vsum2;
  __m256i vsum1;
  int row;
  int i_2;
  uint32_t *src;
  int col;
  __m256i vsrc [5];
  uint32_t acc_5x5_sse [32] [32];
  __m256i diff_hi;
  __m256i diff_lo;
  __m256i v_hi;
  __m256i v_lo;
  __m256i v_mulhi;
  __m256i v_mullo;
  __m256i v_diff;
  __m256i v_src2;
  __m256i v_src1;
  int i;
  uint32_t *dst;
  uint16_t *src2;
  uint16_t *src1;
  __m256i diff_hi_1;
  __m256i diff_lo_1;
  __m256i v_hi_1;
  __m256i v_lo_1;
  __m256i v_mulhi_1;
  __m256i v_mullo_1;
  __m256i v_diff_1;
  __m256i v_src2_1;
  __m256i v_src1_1;
  int i_1;
  uint32_t *dst_1;
  uint16_t *src2_1;
  uint16_t *src1_1;
  __m256i v256tmp1_1;
  __m256i v256tmp1;
  __m128i v128b_23;
  __m128i v128a_23;
  __m256i vtmp_23;
  __m128i v128b_22;
  __m128i v128a_22;
  __m256i vtmp_22;
  __m128i v128b_21;
  __m128i v128a_21;
  __m256i vtmp_21;
  __m128i v128b_20;
  __m128i v128a_20;
  __m256i vtmp_20;
  __m128i v128b_19;
  __m128i v128a_19;
  __m256i vtmp_19;
  __m128i v128b_18;
  __m128i v128a_18;
  __m256i vtmp_18;
  __m128i v128b_17;
  __m128i v128a_17;
  __m256i vtmp_17;
  __m128i v128b_16;
  __m128i v128a_16;
  __m256i vtmp_16;
  __m128i v128b_15;
  __m128i v128a_15;
  __m256i vtmp_15;
  __m128i v128b_14;
  __m128i v128a_14;
  __m256i vtmp_14;
  __m128i v128b_13;
  __m128i v128a_13;
  __m256i vtmp_13;
  __m128i v128b_12;
  __m128i v128a_12;
  __m256i vtmp_12;
  __m128i v128b_11;
  __m128i v128a_11;
  __m256i vtmp_11;
  __m128i v128b_10;
  __m128i v128a_10;
  __m256i vtmp_10;
  __m128i v128b_9;
  __m128i v128a_9;
  __m256i vtmp_9;
  __m128i v128b_8;
  __m128i v128a_8;
  __m256i vtmp_8;
  __m128i v128b_7;
  __m128i v128a_7;
  __m256i vtmp_7;
  __m128i v128b_6;
  __m128i v128a_6;
  __m256i vtmp_6;
  __m128i v128b_5;
  __m128i v128a_5;
  __m256i vtmp_5;
  __m128i v128b_4;
  __m128i v128a_4;
  __m256i vtmp_4;
  __m128i v128b_3;
  __m128i v128a_3;
  __m256i vtmp_3;
  __m128i v128b_2;
  __m128i v128a_2;
  __m256i vtmp_2;
  __m128i v128b_1;
  __m128i v128a_1;
  __m256i vtmp_1;
  __m128i v128b;
  __m128i v128a;
  __m256i vtmp;
  __m256i v256tmp1_3;
  __m256i v256tmp1_2;
  double local_4398;
  double local_4388;
  int local_4344;
  int local_433c;
  int local_4338;
  int local_4304;
  int local_42fc;
  int local_42f8;
  int local_42f4;
  double adStack_42f0 [4];
  double adStack_42d0 [5];
  int local_42a4;
  undefined1 local_42a0 [32];
  undefined1 local_4280 [32];
  undefined1 local_4260 [32];
  undefined1 local_4240 [32];
  int local_4208;
  int local_4204;
  undefined1 local_4200 [32];
  undefined1 local_41e0 [32];
  undefined1 local_41c0 [32];
  undefined1 local_41a0 [32];
  int local_416c;
  int local_4168;
  int local_4164;
  undefined1 local_4160 [32];
  undefined1 local_4140 [32];
  undefined1 local_4120 [32];
  undefined1 local_4100 [32];
  int local_40c8;
  int local_40c4;
  undefined1 local_40c0 [32];
  undefined1 local_40a0 [32];
  undefined1 local_4080 [32];
  undefined1 local_4060 [32];
  int local_402c;
  int local_4028;
  int local_4024;
  undefined1 local_4020 [32];
  undefined1 local_4000 [32];
  undefined1 local_3fe0 [32];
  undefined1 local_3fc0 [32];
  int local_3f88;
  int local_3f84;
  undefined1 local_3f80 [32];
  undefined1 local_3f60 [32];
  undefined1 local_3f40 [32];
  undefined1 local_3f20 [32];
  int local_3ef8;
  int local_3ef4;
  undefined1 (*local_3ef0) [32];
  int local_3ee4;
  undefined8 local_3ee0 [4];
  undefined1 local_3ec0 [32];
  undefined8 local_3ea0 [8];
  undefined1 local_3e60 [32];
  int local_3e30 [1026];
  double local_2e28;
  double local_2e20;
  double local_2e18;
  double local_2e10;
  int local_2e04;
  int local_2e00;
  uint local_2dfc;
  undefined1 (*local_2df8) [32];
  undefined1 local_2de0 [32];
  undefined1 local_2dc0 [32];
  undefined1 local_2da0 [32];
  undefined1 local_2d80 [32];
  undefined1 local_2d60 [32];
  undefined1 local_2d40 [32];
  undefined1 local_2d20 [32];
  undefined8 local_2d00;
  undefined8 uStack_2cf8;
  undefined8 uStack_2cf0;
  undefined8 uStack_2ce8;
  undefined8 local_2ce0;
  undefined8 uStack_2cd8;
  undefined8 uStack_2cd0;
  undefined8 uStack_2cc8;
  int local_2cb4;
  undefined1 (*local_2cb0) [16];
  undefined1 (*local_2ca8) [32];
  undefined1 (*local_2ca0) [32];
  undefined4 local_2c94;
  uint16_t *local_2c90;
  undefined1 local_2c60 [32];
  undefined1 local_2c40 [32];
  undefined1 local_2c20 [32];
  undefined1 local_2c00 [32];
  undefined1 local_2be0 [32];
  undefined1 local_2bc0 [32];
  undefined1 local_2ba0 [32];
  undefined8 local_2b80;
  undefined8 uStack_2b78;
  undefined8 uStack_2b70;
  undefined8 uStack_2b68;
  undefined8 local_2b60;
  undefined8 uStack_2b58;
  undefined8 uStack_2b50;
  undefined8 uStack_2b48;
  int local_2b34;
  undefined1 (*local_2b30) [16];
  undefined1 (*local_2b28) [32];
  undefined1 (*local_2b20) [32];
  undefined4 local_2b14;
  uint16_t *local_2b10;
  undefined1 local_2ae0 [32];
  undefined1 *local_2ab0;
  undefined1 (*local_2aa8) [32];
  undefined1 local_2aa0 [32];
  undefined1 (*local_2a70) [32];
  undefined1 (*local_2a68) [32];
  undefined8 local_2a60;
  undefined8 uStack_2a58;
  undefined8 uStack_2a50;
  undefined8 uStack_2a48;
  undefined8 local_2a40;
  undefined8 uStack_2a38;
  undefined8 uStack_2a30;
  undefined8 uStack_2a28;
  undefined8 local_2a20;
  undefined8 uStack_2a18;
  undefined8 uStack_2a10;
  undefined8 uStack_2a08;
  undefined8 local_2a00;
  undefined8 uStack_29f8;
  undefined8 uStack_29f0;
  undefined8 uStack_29e8;
  undefined8 local_29e0;
  undefined8 uStack_29d8;
  undefined8 uStack_29d0;
  undefined8 uStack_29c8;
  undefined8 local_29c0;
  undefined8 uStack_29b8;
  undefined8 uStack_29b0;
  undefined8 uStack_29a8;
  undefined8 local_29a0;
  undefined8 uStack_2998;
  undefined8 uStack_2990;
  undefined8 uStack_2988;
  undefined8 local_2980;
  undefined8 uStack_2978;
  undefined8 uStack_2970;
  undefined8 uStack_2968;
  undefined8 local_2960;
  undefined8 uStack_2958;
  undefined8 uStack_2950;
  undefined8 uStack_2948;
  undefined8 local_2940;
  undefined8 uStack_2938;
  undefined8 uStack_2930;
  undefined8 uStack_2928;
  undefined8 local_2920;
  undefined8 uStack_2918;
  undefined8 uStack_2910;
  undefined8 uStack_2908;
  undefined8 local_2900;
  undefined8 uStack_28f8;
  undefined8 uStack_28f0;
  undefined8 uStack_28e8;
  undefined8 local_28e0;
  undefined8 uStack_28d8;
  undefined8 uStack_28d0;
  undefined8 uStack_28c8;
  undefined8 local_28c0;
  undefined8 uStack_28b8;
  undefined8 uStack_28b0;
  undefined8 uStack_28a8;
  undefined8 local_28a0;
  undefined8 uStack_2898;
  undefined8 uStack_2890;
  undefined8 uStack_2888;
  undefined8 local_2880;
  undefined8 uStack_2878;
  undefined8 uStack_2870;
  undefined8 uStack_2868;
  undefined8 local_2860;
  undefined8 uStack_2858;
  undefined8 uStack_2850;
  undefined8 uStack_2848;
  undefined8 local_2840;
  undefined8 uStack_2838;
  undefined8 uStack_2830;
  undefined8 uStack_2828;
  undefined8 local_2820;
  undefined8 uStack_2818;
  undefined8 uStack_2810;
  undefined8 uStack_2808;
  undefined8 local_2800;
  undefined8 uStack_27f8;
  undefined8 uStack_27f0;
  undefined8 uStack_27e8;
  undefined8 local_27e0;
  undefined8 uStack_27d8;
  undefined8 uStack_27d0;
  undefined8 uStack_27c8;
  undefined8 local_27c0;
  undefined8 uStack_27b8;
  undefined8 uStack_27b0;
  undefined8 uStack_27a8;
  undefined8 local_27a0;
  undefined8 uStack_2798;
  undefined8 uStack_2790;
  undefined8 uStack_2788;
  undefined8 local_2780;
  undefined8 uStack_2778;
  undefined8 uStack_2770;
  undefined8 uStack_2768;
  undefined8 local_2760;
  undefined8 uStack_2758;
  undefined8 uStack_2750;
  undefined8 uStack_2748;
  undefined8 local_2740;
  undefined8 uStack_2738;
  undefined8 uStack_2730;
  undefined8 uStack_2728;
  undefined8 local_2720;
  undefined8 uStack_2718;
  undefined8 uStack_2710;
  undefined8 uStack_2708;
  undefined8 local_2700;
  undefined8 uStack_26f8;
  undefined8 uStack_26f0;
  undefined8 uStack_26e8;
  undefined8 local_26e0;
  undefined8 uStack_26d8;
  undefined8 uStack_26d0;
  undefined8 uStack_26c8;
  undefined8 local_26c0;
  undefined8 uStack_26b8;
  undefined8 uStack_26b0;
  undefined8 uStack_26a8;
  undefined8 local_26a0;
  undefined8 uStack_2698;
  undefined8 uStack_2690;
  undefined8 uStack_2688;
  undefined8 local_2680;
  undefined8 uStack_2678;
  undefined8 uStack_2670;
  undefined8 uStack_2668;
  undefined8 local_2660;
  undefined8 uStack_2658;
  undefined8 uStack_2650;
  undefined8 uStack_2648;
  undefined8 local_2640;
  undefined8 uStack_2638;
  undefined8 uStack_2630;
  undefined8 uStack_2628;
  undefined8 local_2620;
  undefined8 uStack_2618;
  undefined8 uStack_2610;
  undefined8 uStack_2608;
  undefined8 local_2600;
  undefined8 uStack_25f8;
  undefined8 uStack_25f0;
  undefined8 uStack_25e8;
  undefined8 local_25e0;
  undefined8 uStack_25d8;
  undefined8 uStack_25d0;
  undefined8 uStack_25c8;
  undefined8 local_25c0;
  undefined8 uStack_25b8;
  undefined8 uStack_25b0;
  undefined8 uStack_25a8;
  undefined8 local_25a0;
  undefined8 uStack_2598;
  undefined8 uStack_2590;
  undefined8 uStack_2588;
  undefined8 local_2580;
  undefined8 uStack_2578;
  undefined8 uStack_2570;
  undefined8 uStack_2568;
  undefined8 local_2560;
  undefined8 uStack_2558;
  undefined8 uStack_2550;
  undefined8 uStack_2548;
  undefined8 local_2540;
  undefined8 uStack_2538;
  undefined8 uStack_2530;
  undefined8 uStack_2528;
  undefined8 local_2520;
  undefined8 uStack_2518;
  undefined8 uStack_2510;
  undefined8 uStack_2508;
  undefined8 local_2500;
  undefined8 uStack_24f8;
  undefined8 uStack_24f0;
  undefined8 uStack_24e8;
  undefined8 local_24e0;
  undefined8 uStack_24d8;
  undefined8 uStack_24d0;
  undefined8 uStack_24c8;
  undefined8 local_24c0;
  undefined8 uStack_24b8;
  undefined8 uStack_24b0;
  undefined8 uStack_24a8;
  undefined8 local_24a0;
  undefined8 uStack_2498;
  undefined8 uStack_2490;
  undefined8 uStack_2488;
  undefined8 local_2480;
  undefined8 uStack_2478;
  undefined8 uStack_2470;
  undefined8 uStack_2468;
  undefined1 local_2460 [16];
  undefined1 local_2450 [16];
  undefined1 local_2440 [24];
  undefined8 uStack_2428;
  undefined4 local_2404;
  undefined8 local_2400;
  undefined8 uStack_23f8;
  undefined8 uStack_23f0;
  undefined8 uStack_23e8;
  undefined1 local_23e0 [16];
  undefined1 local_23d0 [16];
  undefined1 local_23c0 [24];
  undefined8 uStack_23a8;
  undefined4 local_2384;
  undefined8 local_2380;
  undefined8 uStack_2378;
  undefined8 uStack_2370;
  undefined8 uStack_2368;
  undefined1 local_2360 [16];
  undefined1 local_2350 [16];
  undefined1 local_2340 [24];
  undefined8 uStack_2328;
  undefined4 local_2304;
  undefined8 local_2300;
  undefined8 uStack_22f8;
  undefined8 uStack_22f0;
  undefined8 uStack_22e8;
  undefined1 local_22e0 [16];
  undefined1 local_22d0 [16];
  undefined1 local_22c0 [24];
  undefined8 uStack_22a8;
  undefined4 local_2284;
  undefined8 local_2280;
  undefined8 uStack_2278;
  undefined8 uStack_2270;
  undefined8 uStack_2268;
  undefined1 local_2260 [16];
  undefined1 local_2250 [16];
  undefined1 local_2240 [24];
  undefined8 uStack_2228;
  undefined4 local_2204;
  undefined8 local_2200;
  undefined8 uStack_21f8;
  undefined8 uStack_21f0;
  undefined8 uStack_21e8;
  undefined1 local_21e0 [16];
  undefined1 local_21d0 [16];
  undefined1 local_21c0 [24];
  undefined8 uStack_21a8;
  undefined4 local_2184;
  undefined8 local_2180;
  undefined8 uStack_2178;
  undefined8 uStack_2170;
  undefined8 uStack_2168;
  undefined1 local_2160 [16];
  undefined1 local_2150 [16];
  undefined1 local_2140 [24];
  undefined8 uStack_2128;
  undefined4 local_2104;
  undefined8 local_2100;
  undefined8 uStack_20f8;
  undefined8 uStack_20f0;
  undefined8 uStack_20e8;
  undefined1 local_20e0 [16];
  undefined1 local_20d0 [16];
  undefined1 local_20c0 [24];
  undefined8 uStack_20a8;
  undefined4 local_2084;
  undefined8 local_2080;
  undefined8 uStack_2078;
  undefined8 uStack_2070;
  undefined8 uStack_2068;
  undefined1 local_2060 [16];
  undefined1 local_2050 [16];
  undefined1 local_2040 [24];
  undefined8 uStack_2028;
  undefined4 local_2004;
  undefined8 local_2000;
  undefined8 uStack_1ff8;
  undefined8 uStack_1ff0;
  undefined8 uStack_1fe8;
  undefined1 local_1fe0 [16];
  undefined1 local_1fd0 [16];
  undefined1 local_1fc0 [24];
  undefined8 uStack_1fa8;
  undefined4 local_1f84;
  undefined8 local_1f80;
  undefined8 uStack_1f78;
  undefined8 uStack_1f70;
  undefined8 uStack_1f68;
  undefined1 local_1f60 [16];
  undefined1 local_1f50 [16];
  undefined1 local_1f40 [24];
  undefined8 uStack_1f28;
  undefined4 local_1f04;
  undefined8 local_1f00;
  undefined8 uStack_1ef8;
  undefined8 uStack_1ef0;
  undefined8 uStack_1ee8;
  undefined1 local_1ee0 [16];
  undefined1 local_1ed0 [16];
  undefined1 local_1ec0 [24];
  undefined8 uStack_1ea8;
  undefined4 local_1e84;
  undefined8 local_1e80;
  undefined8 uStack_1e78;
  undefined8 uStack_1e70;
  undefined8 uStack_1e68;
  undefined1 local_1e60 [16];
  undefined1 local_1e50 [16];
  undefined1 local_1e40 [24];
  undefined8 uStack_1e28;
  undefined4 local_1e04;
  undefined8 local_1e00;
  undefined8 uStack_1df8;
  undefined8 uStack_1df0;
  undefined8 uStack_1de8;
  undefined1 local_1de0 [16];
  undefined1 local_1dd0 [16];
  undefined1 local_1dc0 [24];
  undefined8 uStack_1da8;
  undefined4 local_1d84;
  undefined8 local_1d80;
  undefined8 uStack_1d78;
  undefined8 uStack_1d70;
  undefined8 uStack_1d68;
  undefined1 local_1d60 [16];
  undefined1 local_1d50 [16];
  undefined1 local_1d40 [24];
  undefined8 uStack_1d28;
  undefined4 local_1d04;
  undefined8 local_1d00;
  undefined8 uStack_1cf8;
  undefined8 uStack_1cf0;
  undefined8 uStack_1ce8;
  undefined1 local_1ce0 [16];
  undefined1 local_1cd0 [16];
  undefined1 local_1cc0 [24];
  undefined8 uStack_1ca8;
  undefined4 local_1c84;
  undefined8 local_1c80;
  undefined8 uStack_1c78;
  undefined8 uStack_1c70;
  undefined8 uStack_1c68;
  undefined1 local_1c60 [16];
  undefined1 local_1c50 [16];
  undefined1 local_1c40 [24];
  undefined8 uStack_1c28;
  undefined4 local_1c04;
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  undefined1 local_1be0 [16];
  undefined1 local_1bd0 [16];
  undefined1 local_1bc0 [24];
  undefined8 uStack_1ba8;
  undefined4 local_1b84;
  undefined8 local_1b80;
  undefined8 uStack_1b78;
  undefined8 uStack_1b70;
  undefined8 uStack_1b68;
  undefined1 local_1b60 [16];
  undefined1 local_1b50 [16];
  undefined1 local_1b40 [24];
  undefined8 uStack_1b28;
  undefined4 local_1b04;
  undefined8 local_1b00;
  undefined8 uStack_1af8;
  undefined8 uStack_1af0;
  undefined8 uStack_1ae8;
  undefined1 local_1ae0 [16];
  undefined1 local_1ad0 [16];
  undefined1 local_1ac0 [24];
  undefined8 uStack_1aa8;
  undefined4 local_1a84;
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  undefined1 local_1a60 [16];
  undefined1 local_1a50 [16];
  undefined1 local_1a40 [24];
  undefined8 uStack_1a28;
  undefined4 local_1a04;
  undefined8 local_1a00;
  undefined8 uStack_19f8;
  undefined8 uStack_19f0;
  undefined8 uStack_19e8;
  undefined1 local_19e0 [16];
  undefined1 local_19d0 [16];
  undefined1 local_19c0 [24];
  undefined8 uStack_19a8;
  undefined4 local_1984;
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  undefined1 local_1960 [16];
  undefined1 local_1950 [16];
  undefined1 local_1940 [24];
  undefined8 uStack_1928;
  undefined4 local_1904;
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  undefined1 local_18e0 [16];
  undefined1 local_18d0 [16];
  undefined1 local_18c0 [24];
  undefined8 uStack_18a8;
  undefined4 local_1884;
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined8 uStack_1870;
  undefined8 uStack_1868;
  undefined1 (*local_1850) [32];
  undefined1 (*local_1848) [32];
  undefined1 (*local_1840) [32];
  undefined1 (*local_1838) [32];
  undefined1 (*local_1830) [32];
  undefined1 (*local_1828) [32];
  undefined1 (*local_1820) [32];
  undefined1 (*local_1818) [32];
  undefined1 (*local_1810) [32];
  undefined1 (*local_1808) [32];
  undefined1 local_1800 [40];
  undefined1 *local_17d8;
  undefined1 (*local_17d0) [32];
  undefined1 (*local_17c8) [32];
  undefined1 local_17c0 [32];
  undefined1 (*local_17a0) [32];
  undefined1 (*local_1798) [32];
  undefined1 (*local_1790) [32];
  float local_1784;
  undefined8 local_1780;
  undefined8 uStack_1778;
  undefined8 uStack_1770;
  undefined8 uStack_1768;
  undefined8 local_1760;
  undefined8 uStack_1758;
  undefined8 uStack_1750;
  undefined8 uStack_1748;
  undefined8 local_1740;
  undefined8 uStack_1738;
  undefined8 uStack_1730;
  undefined8 uStack_1728;
  undefined8 local_1720;
  undefined8 uStack_1718;
  undefined8 uStack_1710;
  undefined8 uStack_1708;
  undefined8 local_1700;
  undefined8 uStack_16f8;
  undefined8 uStack_16f0;
  undefined8 uStack_16e8;
  undefined8 local_16e0;
  undefined8 uStack_16d8;
  undefined8 uStack_16d0;
  undefined8 uStack_16c8;
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined8 uStack_16b0;
  undefined8 uStack_16a8;
  undefined8 local_16a0;
  undefined8 uStack_1698;
  undefined8 uStack_1690;
  undefined8 uStack_1688;
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  undefined8 local_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  undefined8 local_1620;
  undefined8 uStack_1618;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  undefined8 local_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined8 local_15a0;
  undefined8 uStack_1598;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined1 (*local_1388) [16];
  undefined1 local_1380 [16];
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined1 (*local_1348) [16];
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined1 (*local_1308) [16];
  undefined1 local_1300 [16];
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined1 (*local_12c8) [16];
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined1 (*local_1288) [16];
  undefined1 local_1280 [16];
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined1 (*local_1248) [16];
  uint32_t local_1240 [2];
  uint32_t auStack_1238 [2];
  uint32_t auStack_1230 [2];
  uint32_t auStack_1228 [2];
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  uint32_t local_1200 [2];
  uint32_t auStack_11f8 [2];
  uint32_t auStack_11f0 [2];
  uint32_t auStack_11e8 [2];
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  uint32_t local_11c0 [2];
  uint32_t auStack_11b8 [2];
  uint32_t auStack_11b0 [2];
  uint32_t auStack_11a8 [2];
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  uint32_t local_1180 [2];
  uint32_t auStack_1178 [2];
  uint32_t auStack_1170 [2];
  uint32_t auStack_1168 [2];
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  uint32_t local_1140 [2];
  uint32_t auStack_1138 [2];
  uint32_t auStack_1130 [2];
  uint32_t auStack_1128 [2];
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  uint32_t local_1100 [2];
  uint32_t auStack_10f8 [2];
  uint32_t auStack_10f0 [2];
  uint32_t auStack_10e8 [2];
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  uint32_t local_10c0 [2];
  uint32_t auStack_10b8 [2];
  uint32_t auStack_10b0 [2];
  uint32_t auStack_10a8 [2];
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  uint32_t local_1080 [2];
  uint32_t auStack_1078 [2];
  uint32_t auStack_1070 [2];
  uint32_t auStack_1068 [2];
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  uint32_t local_1040 [2];
  uint32_t auStack_1038 [2];
  uint32_t auStack_1030 [2];
  uint32_t auStack_1028 [2];
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  uint32_t local_1000 [2];
  uint32_t auStack_ff8 [2];
  uint32_t auStack_ff0 [2];
  uint32_t auStack_fe8 [2];
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  uint32_t local_fc0 [2];
  uint32_t auStack_fb8 [2];
  uint32_t auStack_fb0 [2];
  uint32_t auStack_fa8 [2];
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  uint32_t local_f80 [2];
  uint32_t auStack_f78 [2];
  uint32_t auStack_f70 [2];
  uint32_t auStack_f68 [2];
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  uint32_t local_f40 [2];
  uint32_t auStack_f38 [2];
  uint32_t auStack_f30 [2];
  uint32_t auStack_f28 [2];
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  uint32_t local_f00 [2];
  uint32_t auStack_ef8 [2];
  uint32_t auStack_ef0 [2];
  uint32_t auStack_ee8 [2];
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  uint32_t local_ec0 [2];
  uint32_t auStack_eb8 [2];
  uint32_t auStack_eb0 [2];
  uint32_t auStack_ea8 [2];
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  uint32_t local_e80 [2];
  uint32_t auStack_e78 [2];
  uint32_t auStack_e70 [2];
  uint32_t auStack_e68 [2];
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  uint32_t local_e40 [2];
  uint32_t auStack_e38 [2];
  uint32_t auStack_e30 [2];
  uint32_t auStack_e28 [2];
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  uint32_t local_e00 [2];
  uint32_t auStack_df8 [2];
  uint32_t auStack_df0 [2];
  uint32_t auStack_de8 [2];
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  uint32_t local_dc0 [2];
  uint32_t auStack_db8 [2];
  uint32_t auStack_db0 [2];
  uint32_t auStack_da8 [2];
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  uint32_t local_d80 [2];
  uint32_t auStack_d78 [2];
  uint32_t auStack_d70 [2];
  uint32_t auStack_d68 [2];
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  uint32_t local_d40 [2];
  uint32_t auStack_d38 [2];
  uint32_t auStack_d30 [2];
  uint32_t auStack_d28 [2];
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  uint32_t local_d00 [2];
  uint32_t auStack_cf8 [2];
  uint32_t auStack_cf0 [2];
  uint32_t auStack_ce8 [2];
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  uint32_t local_cc0 [2];
  uint32_t auStack_cb8 [2];
  uint32_t auStack_cb0 [2];
  uint32_t auStack_ca8 [2];
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  uint32_t local_c80 [2];
  uint32_t auStack_c78 [2];
  uint32_t auStack_c70 [2];
  uint32_t auStack_c68 [2];
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 local_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 local_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 local_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 local_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 local_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 local_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 local_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 local_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 local_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 local_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 local_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 local_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 local_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 local_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 local_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 local_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 local_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 local_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 local_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 local_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 local_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 local_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 local_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  auVar30._8_8_ = local_1380._8_8_;
  auVar30._0_8_ = local_1380._0_8_;
  auVar29._8_8_ = local_1300._8_8_;
  auVar29._0_8_ = local_1300._0_8_;
  if (in_R8D == 0x20) {
    local_2c90 = count;
    local_2c94 = 0x24;
    local_2cb0 = (undefined1 (*) [16])(count + 4);
    local_2ca8 = in_RDX;
    local_2ca0 = in_RDI;
    for (local_2cb4 = 0; local_2cb4 < in_R9D; local_2cb4 = local_2cb4 + 1) {
      local_1818 = local_2ca0;
      local_16e0 = *(undefined8 *)*local_2ca0;
      uStack_16d8 = *(undefined8 *)(*local_2ca0 + 8);
      uStack_16d0 = *(undefined8 *)(*local_2ca0 + 0x10);
      uStack_16c8 = *(undefined8 *)(*local_2ca0 + 0x18);
      local_1820 = local_2ca8;
      local_1700 = *(undefined8 *)*local_2ca8;
      uStack_16f8 = *(undefined8 *)(*local_2ca8 + 8);
      uStack_16f0 = *(undefined8 *)(*local_2ca8 + 0x10);
      uStack_16e8 = *(undefined8 *)(*local_2ca8 + 0x18);
      auVar29 = vpsubw_avx2(*local_2ca0,*local_2ca8);
      local_2d20._0_8_ = auVar29._0_8_;
      local_1640 = local_2d20._0_8_;
      local_2d20._8_8_ = auVar29._8_8_;
      uStack_1638 = local_2d20._8_8_;
      local_2d20._16_8_ = auVar29._16_8_;
      uStack_1630 = local_2d20._16_8_;
      local_2d20._24_8_ = auVar29._24_8_;
      uStack_1628 = local_2d20._24_8_;
      auVar2 = vpmullw_avx2(auVar29,auVar29);
      local_1580 = local_2d20._0_8_;
      uStack_1578 = local_2d20._8_8_;
      uStack_1570 = local_2d20._16_8_;
      uStack_1568 = local_2d20._24_8_;
      auVar29 = vpmulhw_avx2(auVar29,auVar29);
      local_2d40._0_8_ = auVar2._0_8_;
      local_14a0 = local_2d40._0_8_;
      local_2d40._8_8_ = auVar2._8_8_;
      uStack_1498 = local_2d40._8_8_;
      local_2d40._16_8_ = auVar2._16_8_;
      uStack_1490 = local_2d40._16_8_;
      local_2d40._24_8_ = auVar2._24_8_;
      uStack_1488 = local_2d40._24_8_;
      local_2d60._0_8_ = auVar29._0_8_;
      local_14c0 = local_2d60._0_8_;
      local_2d60._8_8_ = auVar29._8_8_;
      uStack_14b8 = local_2d60._8_8_;
      local_2d60._16_8_ = auVar29._16_8_;
      uStack_14b0 = local_2d60._16_8_;
      local_2d60._24_8_ = auVar29._24_8_;
      uStack_14a8 = local_2d60._24_8_;
      auVar3 = vpunpcklwd_avx2(auVar2,auVar29);
      local_13e0 = local_2d40._0_8_;
      uStack_13d8 = local_2d40._8_8_;
      uStack_13d0 = local_2d40._16_8_;
      uStack_13c8 = local_2d40._24_8_;
      local_1400 = local_2d60._0_8_;
      uStack_13f8 = local_2d60._8_8_;
      uStack_13f0 = local_2d60._16_8_;
      uStack_13e8 = local_2d60._24_8_;
      auVar29 = vpunpckhwd_avx2(auVar2,auVar29);
      local_2da0._0_16_ = auVar29._0_16_;
      local_1280 = ZEXT116(0) * local_2da0._0_16_ + ZEXT116(1) * auVar3._0_16_;
      auVar32 = ZEXT116(0) * auVar3._16_16_ + ZEXT116(1) * local_2da0._0_16_;
      auVar29 = vblendps_avx(auVar29,ZEXT1632(auVar3._16_16_),0xf);
      local_1248 = local_2cb0;
      local_2dc0._16_8_ = auVar32._0_8_;
      uStack_1270 = local_2dc0._16_8_;
      local_2dc0._24_8_ = auVar32._8_8_;
      uStack_1268 = local_2dc0._24_8_;
      *local_2cb0 = local_1280;
      local_2cb0[1] = auVar32;
      local_1288 = local_2cb0 + 2;
      local_2de0._0_8_ = auVar29._0_8_;
      local_12c0 = local_2de0._0_8_;
      local_2de0._8_8_ = auVar29._8_8_;
      uStack_12b8 = local_2de0._8_8_;
      local_2de0._16_8_ = auVar29._16_8_;
      uStack_12b0 = local_2de0._16_8_;
      local_2de0._24_8_ = auVar29._24_8_;
      uStack_12a8 = local_2de0._24_8_;
      *(undefined8 *)*local_1288 = local_2de0._0_8_;
      *(undefined8 *)(local_2cb0[2] + 8) = local_2de0._8_8_;
      *(undefined8 *)local_2cb0[3] = local_2de0._16_8_;
      *(undefined8 *)(local_2cb0[3] + 8) = local_2de0._24_8_;
      local_1828 = local_2ca0 + 1;
      local_2ce0 = *(undefined8 *)*local_1828;
      uStack_2cd8 = *(undefined8 *)(local_2ca0[1] + 8);
      uStack_2cd0 = *(undefined8 *)(local_2ca0[1] + 0x10);
      uStack_2cc8 = *(undefined8 *)(local_2ca0[1] + 0x18);
      local_1830 = local_2ca8 + 1;
      local_2d00 = *(undefined8 *)*local_1830;
      uStack_2cf8 = *(undefined8 *)(local_2ca8[1] + 8);
      uStack_2cf0 = *(undefined8 *)(local_2ca8[1] + 0x10);
      uStack_2ce8 = *(undefined8 *)(local_2ca8[1] + 0x18);
      local_2d20 = vpsubw_avx2(*local_1828,*local_1830);
      local_1680 = local_2d20._0_8_;
      uStack_1678 = local_2d20._8_8_;
      uStack_1670 = local_2d20._16_8_;
      uStack_1668 = local_2d20._24_8_;
      local_2d40 = vpmullw_avx2(local_2d20,local_2d20);
      local_15c0 = local_2d20._0_8_;
      uStack_15b8 = local_2d20._8_8_;
      uStack_15b0 = local_2d20._16_8_;
      uStack_15a8 = local_2d20._24_8_;
      local_2d60 = vpmulhw_avx2(local_2d20,local_2d20);
      local_14e0 = local_2d40._0_8_;
      uStack_14d8 = local_2d40._8_8_;
      uStack_14d0 = local_2d40._16_8_;
      uStack_14c8 = local_2d40._24_8_;
      local_1500 = local_2d60._0_8_;
      uStack_14f8 = local_2d60._8_8_;
      uStack_14f0 = local_2d60._16_8_;
      uStack_14e8 = local_2d60._24_8_;
      local_2d80 = vpunpcklwd_avx2(local_2d40,local_2d60);
      local_1420 = local_2d40._0_8_;
      uStack_1418 = local_2d40._8_8_;
      uStack_1410 = local_2d40._16_8_;
      uStack_1408 = local_2d40._24_8_;
      local_1440 = local_2d60._0_8_;
      uStack_1438 = local_2d60._8_8_;
      uStack_1430 = local_2d60._16_8_;
      uStack_1428 = local_2d60._24_8_;
      local_2da0 = vpunpckhwd_avx2(local_2d40,local_2d60);
      auVar29._0_16_ = ZEXT116(0) * local_2da0._0_16_ + ZEXT116(1) * local_2d80._0_16_;
      auVar29._16_16_ = ZEXT116(0) * local_2d80._16_16_ + ZEXT116(1) * local_2da0._0_16_;
      local_2de0 = vblendps_avx(local_2da0,ZEXT1632(local_2d80._16_16_),0xf);
      local_12c8 = local_2cb0 + 4;
      local_2dc0._16_8_ = auVar29._16_8_;
      uStack_12f0 = local_2dc0._16_8_;
      local_2dc0._24_8_ = auVar29._24_8_;
      uStack_12e8 = local_2dc0._24_8_;
      *local_12c8 = auVar29._0_16_;
      local_2cb0[5] = auVar29._16_16_;
      local_1308 = local_2cb0 + 6;
      local_1340 = local_2de0._0_8_;
      uStack_1338 = local_2de0._8_8_;
      uStack_1330 = local_2de0._16_8_;
      uStack_1328 = local_2de0._24_8_;
      *(undefined8 *)*local_1308 = local_2de0._0_8_;
      *(undefined8 *)(local_2cb0[6] + 8) = local_2de0._8_8_;
      *(undefined8 *)local_2cb0[7] = local_2de0._16_8_;
      *(undefined8 *)(local_2cb0[7] + 8) = local_2de0._24_8_;
      local_2ca0 = (undefined1 (*) [32])(*local_2ca0 + (ulong)in_ESI * 2);
      local_2ca8 = (undefined1 (*) [32])(*local_2ca8 + (ulong)in_ECX * 2);
      local_2cb0 = local_2cb0 + 9;
      local_2dc0 = auVar29;
      local_1740 = local_2d00;
      uStack_1738 = uStack_2cf8;
      uStack_1730 = uStack_2cf0;
      uStack_1728 = uStack_2ce8;
      local_1720 = local_2ce0;
      uStack_1718 = uStack_2cd8;
      uStack_1710 = uStack_2cd0;
      uStack_1708 = uStack_2cc8;
      local_1660 = local_1680;
      uStack_1658 = uStack_1678;
      uStack_1650 = uStack_1670;
      uStack_1648 = uStack_1668;
      local_1620 = local_1640;
      uStack_1618 = uStack_1638;
      uStack_1610 = uStack_1630;
      uStack_1608 = uStack_1628;
      local_15a0 = local_15c0;
      uStack_1598 = uStack_15b8;
      uStack_1590 = uStack_15b0;
      uStack_1588 = uStack_15a8;
      local_1560 = local_1580;
      uStack_1558 = uStack_1578;
      uStack_1550 = uStack_1570;
      uStack_1548 = uStack_1568;
    }
  }
  else {
    local_2b10 = count;
    local_2b14 = 0x24;
    local_2b30 = (undefined1 (*) [16])(count + 4);
    local_2b28 = in_RDX;
    local_2b20 = in_RDI;
    for (local_2b34 = 0; local_2b34 < in_R9D; local_2b34 = local_2b34 + 1) {
      local_1838 = local_2b20;
      local_2b60 = *(undefined8 *)*local_2b20;
      uStack_2b58 = *(undefined8 *)(*local_2b20 + 8);
      uStack_2b50 = *(undefined8 *)(*local_2b20 + 0x10);
      uStack_2b48 = *(undefined8 *)(*local_2b20 + 0x18);
      local_1840 = local_2b28;
      local_2b80 = *(undefined8 *)*local_2b28;
      uStack_2b78 = *(undefined8 *)(*local_2b28 + 8);
      uStack_2b70 = *(undefined8 *)(*local_2b28 + 0x10);
      uStack_2b68 = *(undefined8 *)(*local_2b28 + 0x18);
      local_2ba0 = vpsubw_avx2(*local_2b20,*local_2b28);
      local_16c0 = local_2ba0._0_8_;
      uStack_16b8 = local_2ba0._8_8_;
      uStack_16b0 = local_2ba0._16_8_;
      uStack_16a8 = local_2ba0._24_8_;
      local_2bc0 = vpmullw_avx2(local_2ba0,local_2ba0);
      local_1600 = local_2ba0._0_8_;
      uStack_15f8 = local_2ba0._8_8_;
      uStack_15f0 = local_2ba0._16_8_;
      uStack_15e8 = local_2ba0._24_8_;
      local_2be0 = vpmulhw_avx2(local_2ba0,local_2ba0);
      local_1520 = local_2bc0._0_8_;
      uStack_1518 = local_2bc0._8_8_;
      uStack_1510 = local_2bc0._16_8_;
      uStack_1508 = local_2bc0._24_8_;
      local_1540 = local_2be0._0_8_;
      uStack_1538 = local_2be0._8_8_;
      uStack_1530 = local_2be0._16_8_;
      uStack_1528 = local_2be0._24_8_;
      local_2c00 = vpunpcklwd_avx2(local_2bc0,local_2be0);
      local_1460 = local_2bc0._0_8_;
      uStack_1458 = local_2bc0._8_8_;
      uStack_1450 = local_2bc0._16_8_;
      uStack_1448 = local_2bc0._24_8_;
      local_1480 = local_2be0._0_8_;
      uStack_1478 = local_2be0._8_8_;
      uStack_1470 = local_2be0._16_8_;
      uStack_1468 = local_2be0._24_8_;
      local_2c20 = vpunpckhwd_avx2(local_2bc0,local_2be0);
      auVar30._0_16_ = ZEXT116(0) * local_2c20._0_16_ + ZEXT116(1) * local_2c00._0_16_;
      auVar30._16_16_ = ZEXT116(0) * local_2c00._16_16_ + ZEXT116(1) * local_2c20._0_16_;
      local_2c60 = vblendps_avx(local_2c20,ZEXT1632(local_2c00._16_16_),0xf);
      local_1348 = local_2b30;
      local_2c40._16_8_ = auVar30._16_8_;
      uStack_1370 = local_2c40._16_8_;
      local_2c40._24_8_ = auVar30._24_8_;
      uStack_1368 = local_2c40._24_8_;
      *local_2b30 = auVar30._0_16_;
      local_2b30[1] = auVar30._16_16_;
      local_1388 = local_2b30 + 2;
      local_13c0 = local_2c60._0_8_;
      uStack_13b8 = local_2c60._8_8_;
      uStack_13b0 = local_2c60._16_8_;
      uStack_13a8 = local_2c60._24_8_;
      *(undefined8 *)*local_1388 = local_2c60._0_8_;
      *(undefined8 *)(local_2b30[2] + 8) = local_2c60._8_8_;
      *(undefined8 *)local_2b30[3] = local_2c60._16_8_;
      *(undefined8 *)(local_2b30[3] + 8) = local_2c60._24_8_;
      local_2b20 = (undefined1 (*) [32])(*local_2b20 + (ulong)in_ESI * 2);
      local_2b28 = (undefined1 (*) [32])(*local_2b28 + (ulong)in_ECX * 2);
      local_2b30 = local_2b30 + 9;
      local_2c40 = auVar30;
      local_1780 = local_2b80;
      uStack_1778 = uStack_2b78;
      uStack_1770 = uStack_2b70;
      uStack_1768 = uStack_2b68;
      local_1760 = local_2b60;
      uStack_1758 = uStack_2b58;
      uStack_1750 = uStack_2b50;
      uStack_1748 = uStack_2b48;
      local_16a0 = local_16c0;
      uStack_1698 = uStack_16b8;
      uStack_1690 = uStack_16b0;
      uStack_1688 = uStack_16a8;
      local_15e0 = local_1600;
      uStack_15d8 = uStack_15f8;
      uStack_15d0 = uStack_15f0;
      uStack_15c8 = uStack_15e8;
    }
  }
  local_3ef0 = (undefined1 (*) [32])count;
  for (local_3ef4 = 2; local_3ef4 < 5; local_3ef4 = local_3ef4 + 1) {
    lVar24 = (long)local_3ef4;
    local_2a70 = (undefined1 (*) [32])(local_3ee0 + lVar24 * 4);
    local_2a68 = local_3ef0;
    local_1850 = local_3ef0;
    uVar4 = *(undefined8 *)(*local_3ef0 + 8);
    uVar5 = *(undefined8 *)(*local_3ef0 + 0x10);
    uVar6 = *(undefined8 *)(*local_3ef0 + 0x18);
    *(undefined8 *)*local_2a70 = *(undefined8 *)*local_3ef0;
    local_3ee0[lVar24 * 4 + 1] = uVar4;
    local_3ee0[lVar24 * 4 + 2] = uVar5;
    *(undefined8 *)(local_3ec0 + lVar24 * 0x20 + -8) = uVar6;
    local_2aa0 = vpshufd_avx2(*local_2a70,0xea);
    auVar2 = vblendps_avx(*local_2a70,ZEXT1632(local_2aa0._0_16_),0xf);
    *local_2a70 = auVar2;
    local_3ef0 = (undefined1 (*) [32])(local_3ef0[4] + 0x10);
  }
  local_3ee0[0] = local_3ea0[0];
  local_3ee0[1] = local_3ea0[1];
  local_3ee0[2] = local_3ea0[2];
  local_3ee0[3] = local_3ea0[3];
  local_3ec0._8_8_ = local_3ea0[1];
  local_3ec0._0_8_ = local_3ea0[0];
  local_3ec0._16_8_ = local_3ea0[2];
  local_3ec0._24_8_ = local_3ea0[3];
  local_3ef8 = 0;
  local_2e28 = in_XMM3_Qa;
  while( true ) {
    if (in_R9D + -3 <= local_3ef8) break;
    local_2480 = local_3ee0[0];
    uStack_2478 = local_3ee0[1];
    uStack_2470 = local_3ee0[2];
    uStack_2468 = local_3ee0[3];
    local_24a0 = local_3ec0._0_8_;
    uStack_2498 = local_3ec0._8_8_;
    uStack_2490 = local_3ec0._16_8_;
    uStack_2488 = local_3ec0._24_8_;
    auVar22._8_8_ = local_3ee0[1];
    auVar22._0_8_ = local_3ee0[0];
    auVar22._16_8_ = local_3ee0[2];
    auVar22._24_8_ = local_3ee0[3];
    local_3f20 = vpaddd_avx2(auVar22,local_3ec0);
    local_24c0 = local_3ea0[0];
    uStack_24b8 = local_3ea0[1];
    uStack_24b0 = local_3ea0[2];
    uStack_24a8 = local_3ea0[3];
    local_24e0 = local_3ea0[4];
    uStack_24d8 = local_3ea0[5];
    uStack_24d0 = local_3ea0[6];
    uStack_24c8 = local_3ea0[7];
    auVar3._8_8_ = local_3ea0[1];
    auVar3._0_8_ = local_3ea0[0];
    auVar3._16_8_ = local_3ea0[2];
    auVar3._24_8_ = local_3ea0[3];
    auVar2._8_8_ = local_3ea0[5];
    auVar2._0_8_ = local_3ea0[4];
    auVar2._16_8_ = local_3ea0[6];
    auVar2._24_8_ = local_3ea0[7];
    local_3f40 = vpaddd_avx2(auVar3,auVar2);
    local_2500 = local_3f20._0_8_;
    uStack_24f8 = local_3f20._8_8_;
    uStack_24f0 = local_3f20._16_8_;
    uStack_24e8 = local_3f20._24_8_;
    local_2520 = local_3f40._0_8_;
    uStack_2518 = local_3f40._8_8_;
    uStack_2510 = local_3f40._16_8_;
    uStack_2508 = local_3f40._24_8_;
    local_3f60 = vpaddd_avx2(local_3f20,local_3f40);
    local_2540 = local_3f60._0_8_;
    uStack_2538 = local_3f60._8_8_;
    uStack_2530 = local_3f60._16_8_;
    uStack_2528 = local_3f60._24_8_;
    local_2560 = local_3e60._0_8_;
    uStack_2558 = local_3e60._8_8_;
    uStack_2550 = local_3e60._16_8_;
    uStack_2548 = local_3e60._24_8_;
    local_3f80 = vpaddd_avx2(local_3f60,local_3e60);
    for (local_3f84 = 0; local_3f84 < 4; local_3f84 = local_3f84 + 1) {
      lVar24 = (long)(local_3f84 + 1);
      uVar4 = local_3ee0[lVar24 * 4 + 1];
      uVar5 = local_3ee0[lVar24 * 4 + 2];
      uVar6 = *(undefined8 *)(local_3ec0 + lVar24 * 0x20 + -8);
      lVar26 = (long)local_3f84;
      local_3ee0[lVar26 * 4] = local_3ee0[lVar24 * 4];
      local_3ee0[lVar26 * 4 + 1] = uVar4;
      local_3ee0[lVar26 * 4 + 2] = uVar5;
      *(undefined8 *)(local_3ec0 + lVar26 * 0x20 + -8) = uVar6;
    }
    local_2ab0 = local_3e60;
    local_2aa8 = local_3ef0;
    local_1848 = local_3ef0;
    local_2ae0 = vpshufd_avx2(*local_3ef0,0xea);
    local_3e60 = vblendps_avx(*local_3ef0,ZEXT1632(local_2ae0._0_16_),0xf);
    local_3ef0 = (undefined1 (*) [32])(local_3ef0[4] + 0x10);
    local_1880 = local_3f80._0_8_;
    uStack_1878 = local_3f80._8_8_;
    uStack_1870 = local_3f80._16_8_;
    uStack_1868 = local_3f80._24_8_;
    local_1884 = 0;
    local_1240[0] = 0xffffffff;
    local_1240[1] = 0xffffffff;
    auStack_1238[0] = 0xffffffff;
    auStack_1238[1] = 0xffffffff;
    auStack_1230[0] = 0xffffffff;
    auStack_1230[1] = 0;
    auStack_1228[0] = 0;
    auStack_1228[1] = 0;
    local_1220 = local_3f80._0_8_;
    uStack_1218 = local_3f80._8_8_;
    uStack_1210 = local_3f80._16_8_;
    uStack_1208 = local_3f80._24_8_;
    _local_18c0 = vpand_avx2(local_3f80,(undefined1  [32])sse_bytemask[0]);
    auVar19 = _local_18c0;
    local_c40 = local_18c0._0_8_;
    uStack_c38 = local_18c0._8_8_;
    uStack_c30 = local_18c0._16_8_;
    uStack_c28 = uStack_18a8;
    uStack_8d8 = uStack_18a8;
    local_8e0 = local_18c0._16_8_;
    local_8f0 = local_18e0._0_8_;
    uStack_8e8 = local_18e0._8_8_;
    auVar32 = vpaddd_avx(stack0xffffffffffffe750,local_18e0);
    auVar28 = vpsrldq_avx(auVar32,8);
    local_18d0._0_8_ = auVar32._0_8_;
    local_18d0._8_8_ = auVar32._8_8_;
    local_18e0._0_8_ = auVar28._0_8_;
    local_18e0._8_8_ = auVar28._8_8_;
    local_900 = local_18d0._0_8_;
    uStack_8f8 = local_18d0._8_8_;
    local_910 = local_18e0._0_8_;
    uStack_908 = local_18e0._8_8_;
    auVar32 = vpaddd_avx(auVar32,auVar28);
    local_18e0 = vpsrldq_avx(auVar32,4);
    local_18d0._0_8_ = auVar32._0_8_;
    local_18d0._8_8_ = auVar32._8_8_;
    local_920 = local_18d0._0_8_;
    uStack_918 = local_18d0._8_8_;
    local_930 = local_18e0._0_8_;
    uStack_928 = local_18e0._8_8_;
    local_18d0 = vpaddd_avx(auVar32,local_18e0);
    local_3e30[(long)local_3ef8 * 0x20] = local_18d0._0_4_;
    local_1900 = local_3f80._0_8_;
    uStack_18f8 = local_3f80._8_8_;
    uStack_18f0 = local_3f80._16_8_;
    uStack_18e8 = local_3f80._24_8_;
    local_1904 = 1;
    local_1200[0] = 0;
    local_1200[1] = 0xffffffff;
    auStack_11f8[0] = 0xffffffff;
    auStack_11f8[1] = 0xffffffff;
    auStack_11f0[0] = 0xffffffff;
    auStack_11f0[1] = 0xffffffff;
    auStack_11e8[0] = 0;
    auStack_11e8[1] = 0;
    local_11e0 = local_3f80._0_8_;
    uStack_11d8 = local_3f80._8_8_;
    uStack_11d0 = local_3f80._16_8_;
    uStack_11c8 = local_3f80._24_8_;
    _local_1940 = vpand_avx2(local_3f80,(undefined1  [32])sse_bytemask[1]);
    auVar22 = _local_1940;
    local_c20 = local_1940._0_8_;
    uStack_c18 = local_1940._8_8_;
    uStack_c10 = local_1940._16_8_;
    uStack_c08 = uStack_1928;
    uStack_878 = uStack_1928;
    local_880 = local_1940._16_8_;
    local_890 = local_1960._0_8_;
    uStack_888 = local_1960._8_8_;
    auVar32 = vpaddd_avx(stack0xffffffffffffe6d0,local_1960);
    auVar28 = vpsrldq_avx(auVar32,8);
    local_1950._0_8_ = auVar32._0_8_;
    local_1950._8_8_ = auVar32._8_8_;
    local_1960._0_8_ = auVar28._0_8_;
    local_1960._8_8_ = auVar28._8_8_;
    local_8a0 = local_1950._0_8_;
    uStack_898 = local_1950._8_8_;
    local_8b0 = local_1960._0_8_;
    uStack_8a8 = local_1960._8_8_;
    auVar32 = vpaddd_avx(auVar32,auVar28);
    local_1960 = vpsrldq_avx(auVar32,4);
    local_1950._0_8_ = auVar32._0_8_;
    local_1950._8_8_ = auVar32._8_8_;
    local_8c0 = local_1950._0_8_;
    uStack_8b8 = local_1950._8_8_;
    local_8d0 = local_1960._0_8_;
    uStack_8c8 = local_1960._8_8_;
    local_1950 = vpaddd_avx(auVar32,local_1960);
    local_3e30[(long)local_3ef8 * 0x20 + 1] = local_1950._0_4_;
    local_1980 = local_3f80._0_8_;
    uStack_1978 = local_3f80._8_8_;
    uStack_1970 = local_3f80._16_8_;
    uStack_1968 = local_3f80._24_8_;
    local_1984 = 2;
    local_11c0[0] = 0;
    local_11c0[1] = 0;
    auStack_11b8[0] = 0xffffffff;
    auStack_11b8[1] = 0xffffffff;
    auStack_11b0[0] = 0xffffffff;
    auStack_11b0[1] = 0xffffffff;
    auStack_11a8[0] = 0xffffffff;
    auStack_11a8[1] = 0;
    local_11a0 = local_3f80._0_8_;
    uStack_1198 = local_3f80._8_8_;
    uStack_1190 = local_3f80._16_8_;
    uStack_1188 = local_3f80._24_8_;
    _local_19c0 = vpand_avx2(local_3f80,(undefined1  [32])sse_bytemask[2]);
    auVar3 = _local_19c0;
    local_c00 = local_19c0._0_8_;
    uStack_bf8 = local_19c0._8_8_;
    uStack_bf0 = local_19c0._16_8_;
    uStack_be8 = uStack_19a8;
    uStack_818 = uStack_19a8;
    local_820 = local_19c0._16_8_;
    local_830 = local_19e0._0_8_;
    uStack_828 = local_19e0._8_8_;
    auVar32 = vpaddd_avx(stack0xffffffffffffe650,local_19e0);
    auVar28 = vpsrldq_avx(auVar32,8);
    local_19d0._0_8_ = auVar32._0_8_;
    local_19d0._8_8_ = auVar32._8_8_;
    local_19e0._0_8_ = auVar28._0_8_;
    local_19e0._8_8_ = auVar28._8_8_;
    local_840 = local_19d0._0_8_;
    uStack_838 = local_19d0._8_8_;
    local_850 = local_19e0._0_8_;
    uStack_848 = local_19e0._8_8_;
    auVar32 = vpaddd_avx(auVar32,auVar28);
    local_19e0 = vpsrldq_avx(auVar32,4);
    local_19d0._0_8_ = auVar32._0_8_;
    local_19d0._8_8_ = auVar32._8_8_;
    local_860 = local_19d0._0_8_;
    uStack_858 = local_19d0._8_8_;
    local_870 = local_19e0._0_8_;
    uStack_868 = local_19e0._8_8_;
    local_19d0 = vpaddd_avx(auVar32,local_19e0);
    local_3e30[(long)local_3ef8 * 0x20 + 2] = local_19d0._0_4_;
    local_1a00 = local_3f80._0_8_;
    uStack_19f8 = local_3f80._8_8_;
    uStack_19f0 = local_3f80._16_8_;
    uStack_19e8 = local_3f80._24_8_;
    local_1a04 = 3;
    local_1180[0] = 0;
    local_1180[1] = 0;
    auStack_1178[0] = 0;
    auStack_1178[1] = 0xffffffff;
    auStack_1170[0] = 0xffffffff;
    auStack_1170[1] = 0xffffffff;
    auStack_1168[0] = 0xffffffff;
    auStack_1168[1] = 0xffffffff;
    local_1160 = local_3f80._0_8_;
    uStack_1158 = local_3f80._8_8_;
    uStack_1150 = local_3f80._16_8_;
    uStack_1148 = local_3f80._24_8_;
    _local_1a40 = vpand_avx2(local_3f80,(undefined1  [32])sse_bytemask[3]);
    auVar2 = _local_1a40;
    local_be0 = local_1a40._0_8_;
    uStack_bd8 = local_1a40._8_8_;
    uStack_bd0 = local_1a40._16_8_;
    uStack_bc8 = uStack_1a28;
    uStack_7b8 = uStack_1a28;
    local_7c0 = local_1a40._16_8_;
    local_7d0 = local_1a60._0_8_;
    uStack_7c8 = local_1a60._8_8_;
    auVar32 = vpaddd_avx(stack0xffffffffffffe5d0,local_1a60);
    auVar28 = vpsrldq_avx(auVar32,8);
    local_1a50._0_8_ = auVar32._0_8_;
    local_1a50._8_8_ = auVar32._8_8_;
    local_1a60._0_8_ = auVar28._0_8_;
    local_1a60._8_8_ = auVar28._8_8_;
    local_7e0 = local_1a50._0_8_;
    uStack_7d8 = local_1a50._8_8_;
    local_7f0 = local_1a60._0_8_;
    uStack_7e8 = local_1a60._8_8_;
    auVar32 = vpaddd_avx(auVar32,auVar28);
    local_1a60 = vpsrldq_avx(auVar32,4);
    local_1a50._0_8_ = auVar32._0_8_;
    local_1a50._8_8_ = auVar32._8_8_;
    local_800 = local_1a50._0_8_;
    uStack_7f8 = local_1a50._8_8_;
    local_810 = local_1a60._0_8_;
    uStack_808 = local_1a60._8_8_;
    local_1a50 = vpaddd_avx(auVar32,local_1a60);
    local_3e30[(long)local_3ef8 * 0x20 + 3] = local_1a50._0_4_;
    local_3ef8 = local_3ef8 + 1;
    _local_1a40 = auVar2;
    _local_19c0 = auVar3;
    _local_1940 = auVar22;
    _local_18c0 = auVar19;
  }
  local_3f88 = in_R9D + -3;
  while( true ) {
    if (in_R9D <= local_3f88) break;
    local_2580 = local_3ee0[0];
    uStack_2578 = local_3ee0[1];
    uStack_2570 = local_3ee0[2];
    uStack_2568 = local_3ee0[3];
    local_25a0 = local_3ec0._0_8_;
    uStack_2598 = local_3ec0._8_8_;
    uStack_2590 = local_3ec0._16_8_;
    uStack_2588 = local_3ec0._24_8_;
    auVar21._8_8_ = local_3ee0[1];
    auVar21._0_8_ = local_3ee0[0];
    auVar21._16_8_ = local_3ee0[2];
    auVar21._24_8_ = local_3ee0[3];
    local_3fc0 = vpaddd_avx2(auVar21,local_3ec0);
    local_25c0 = local_3ea0[0];
    uStack_25b8 = local_3ea0[1];
    uStack_25b0 = local_3ea0[2];
    uStack_25a8 = local_3ea0[3];
    local_25e0 = local_3ea0[4];
    uStack_25d8 = local_3ea0[5];
    uStack_25d0 = local_3ea0[6];
    uStack_25c8 = local_3ea0[7];
    auVar20._8_8_ = local_3ea0[1];
    auVar20._0_8_ = local_3ea0[0];
    auVar20._16_8_ = local_3ea0[2];
    auVar20._24_8_ = local_3ea0[3];
    auVar19._8_8_ = local_3ea0[5];
    auVar19._0_8_ = local_3ea0[4];
    auVar19._16_8_ = local_3ea0[6];
    auVar19._24_8_ = local_3ea0[7];
    local_3fe0 = vpaddd_avx2(auVar20,auVar19);
    local_2600 = local_3fc0._0_8_;
    uStack_25f8 = local_3fc0._8_8_;
    uStack_25f0 = local_3fc0._16_8_;
    uStack_25e8 = local_3fc0._24_8_;
    local_2620 = local_3fe0._0_8_;
    uStack_2618 = local_3fe0._8_8_;
    uStack_2610 = local_3fe0._16_8_;
    uStack_2608 = local_3fe0._24_8_;
    local_4000 = vpaddd_avx2(local_3fc0,local_3fe0);
    local_2640 = local_4000._0_8_;
    uStack_2638 = local_4000._8_8_;
    uStack_2630 = local_4000._16_8_;
    uStack_2628 = local_4000._24_8_;
    local_2660 = local_3e60._0_8_;
    uStack_2658 = local_3e60._8_8_;
    uStack_2650 = local_3e60._16_8_;
    uStack_2648 = local_3e60._24_8_;
    local_4020 = vpaddd_avx2(local_4000,local_3e60);
    for (local_4024 = 0; local_4024 < 4; local_4024 = local_4024 + 1) {
      lVar24 = (long)(local_4024 + 1);
      uVar4 = local_3ee0[lVar24 * 4 + 1];
      uVar5 = local_3ee0[lVar24 * 4 + 2];
      uVar6 = *(undefined8 *)(local_3ec0 + lVar24 * 0x20 + -8);
      lVar26 = (long)local_4024;
      local_3ee0[lVar26 * 4] = local_3ee0[lVar24 * 4];
      local_3ee0[lVar26 * 4 + 1] = uVar4;
      local_3ee0[lVar26 * 4 + 2] = uVar5;
      *(undefined8 *)(local_3ec0 + lVar26 * 0x20 + -8) = uVar6;
    }
    local_1a80 = local_4020._0_8_;
    uStack_1a78 = local_4020._8_8_;
    uStack_1a70 = local_4020._16_8_;
    uStack_1a68 = local_4020._24_8_;
    local_1a84 = 0;
    local_1140[0] = 0xffffffff;
    local_1140[1] = 0xffffffff;
    auStack_1138[0] = 0xffffffff;
    auStack_1138[1] = 0xffffffff;
    auStack_1130[0] = 0xffffffff;
    auStack_1130[1] = 0;
    auStack_1128[0] = 0;
    auStack_1128[1] = 0;
    local_1120 = local_4020._0_8_;
    uStack_1118 = local_4020._8_8_;
    uStack_1110 = local_4020._16_8_;
    uStack_1108 = local_4020._24_8_;
    _local_1ac0 = vpand_avx2(local_4020,(undefined1  [32])sse_bytemask[0]);
    auVar19 = _local_1ac0;
    local_bc0 = local_1ac0._0_8_;
    uStack_bb8 = local_1ac0._8_8_;
    uStack_bb0 = local_1ac0._16_8_;
    uStack_ba8 = uStack_1aa8;
    uStack_758 = uStack_1aa8;
    local_760 = local_1ac0._16_8_;
    local_770 = local_1ae0._0_8_;
    uStack_768 = local_1ae0._8_8_;
    auVar32 = vpaddd_avx(stack0xffffffffffffe550,local_1ae0);
    auVar28 = vpsrldq_avx(auVar32,8);
    local_1ad0._0_8_ = auVar32._0_8_;
    local_1ad0._8_8_ = auVar32._8_8_;
    local_1ae0._0_8_ = auVar28._0_8_;
    local_1ae0._8_8_ = auVar28._8_8_;
    local_780 = local_1ad0._0_8_;
    uStack_778 = local_1ad0._8_8_;
    local_790 = local_1ae0._0_8_;
    uStack_788 = local_1ae0._8_8_;
    auVar32 = vpaddd_avx(auVar32,auVar28);
    local_1ae0 = vpsrldq_avx(auVar32,4);
    local_1ad0._0_8_ = auVar32._0_8_;
    local_1ad0._8_8_ = auVar32._8_8_;
    local_7a0 = local_1ad0._0_8_;
    uStack_798 = local_1ad0._8_8_;
    local_7b0 = local_1ae0._0_8_;
    uStack_7a8 = local_1ae0._8_8_;
    local_1ad0 = vpaddd_avx(auVar32,local_1ae0);
    local_3e30[(long)local_3f88 * 0x20] = local_1ad0._0_4_;
    local_1b00 = local_4020._0_8_;
    uStack_1af8 = local_4020._8_8_;
    uStack_1af0 = local_4020._16_8_;
    uStack_1ae8 = local_4020._24_8_;
    local_1b04 = 1;
    local_1100[0] = 0;
    local_1100[1] = 0xffffffff;
    auStack_10f8[0] = 0xffffffff;
    auStack_10f8[1] = 0xffffffff;
    auStack_10f0[0] = 0xffffffff;
    auStack_10f0[1] = 0xffffffff;
    auStack_10e8[0] = 0;
    auStack_10e8[1] = 0;
    local_10e0 = local_4020._0_8_;
    uStack_10d8 = local_4020._8_8_;
    uStack_10d0 = local_4020._16_8_;
    uStack_10c8 = local_4020._24_8_;
    _local_1b40 = vpand_avx2(local_4020,(undefined1  [32])sse_bytemask[1]);
    auVar22 = _local_1b40;
    local_ba0 = local_1b40._0_8_;
    uStack_b98 = local_1b40._8_8_;
    uStack_b90 = local_1b40._16_8_;
    uStack_b88 = uStack_1b28;
    uStack_6f8 = uStack_1b28;
    local_700 = local_1b40._16_8_;
    local_710 = local_1b60._0_8_;
    uStack_708 = local_1b60._8_8_;
    auVar32 = vpaddd_avx(stack0xffffffffffffe4d0,local_1b60);
    auVar28 = vpsrldq_avx(auVar32,8);
    local_1b50._0_8_ = auVar32._0_8_;
    local_1b50._8_8_ = auVar32._8_8_;
    local_1b60._0_8_ = auVar28._0_8_;
    local_1b60._8_8_ = auVar28._8_8_;
    local_720 = local_1b50._0_8_;
    uStack_718 = local_1b50._8_8_;
    local_730 = local_1b60._0_8_;
    uStack_728 = local_1b60._8_8_;
    auVar32 = vpaddd_avx(auVar32,auVar28);
    local_1b60 = vpsrldq_avx(auVar32,4);
    local_1b50._0_8_ = auVar32._0_8_;
    local_1b50._8_8_ = auVar32._8_8_;
    local_740 = local_1b50._0_8_;
    uStack_738 = local_1b50._8_8_;
    local_750 = local_1b60._0_8_;
    uStack_748 = local_1b60._8_8_;
    local_1b50 = vpaddd_avx(auVar32,local_1b60);
    local_3e30[(long)local_3f88 * 0x20 + 1] = local_1b50._0_4_;
    local_1b80 = local_4020._0_8_;
    uStack_1b78 = local_4020._8_8_;
    uStack_1b70 = local_4020._16_8_;
    uStack_1b68 = local_4020._24_8_;
    local_1b84 = 2;
    local_10c0[0] = 0;
    local_10c0[1] = 0;
    auStack_10b8[0] = 0xffffffff;
    auStack_10b8[1] = 0xffffffff;
    auStack_10b0[0] = 0xffffffff;
    auStack_10b0[1] = 0xffffffff;
    auStack_10a8[0] = 0xffffffff;
    auStack_10a8[1] = 0;
    local_10a0 = local_4020._0_8_;
    uStack_1098 = local_4020._8_8_;
    uStack_1090 = local_4020._16_8_;
    uStack_1088 = local_4020._24_8_;
    _local_1bc0 = vpand_avx2(local_4020,(undefined1  [32])sse_bytemask[2]);
    auVar3 = _local_1bc0;
    local_b80 = local_1bc0._0_8_;
    uStack_b78 = local_1bc0._8_8_;
    uStack_b70 = local_1bc0._16_8_;
    uStack_b68 = uStack_1ba8;
    uStack_698 = uStack_1ba8;
    local_6a0 = local_1bc0._16_8_;
    local_6b0 = local_1be0._0_8_;
    uStack_6a8 = local_1be0._8_8_;
    auVar32 = vpaddd_avx(stack0xffffffffffffe450,local_1be0);
    auVar28 = vpsrldq_avx(auVar32,8);
    local_1bd0._0_8_ = auVar32._0_8_;
    local_1bd0._8_8_ = auVar32._8_8_;
    local_1be0._0_8_ = auVar28._0_8_;
    local_1be0._8_8_ = auVar28._8_8_;
    local_6c0 = local_1bd0._0_8_;
    uStack_6b8 = local_1bd0._8_8_;
    local_6d0 = local_1be0._0_8_;
    uStack_6c8 = local_1be0._8_8_;
    auVar32 = vpaddd_avx(auVar32,auVar28);
    local_1be0 = vpsrldq_avx(auVar32,4);
    local_1bd0._0_8_ = auVar32._0_8_;
    local_1bd0._8_8_ = auVar32._8_8_;
    local_6e0 = local_1bd0._0_8_;
    uStack_6d8 = local_1bd0._8_8_;
    local_6f0 = local_1be0._0_8_;
    uStack_6e8 = local_1be0._8_8_;
    local_1bd0 = vpaddd_avx(auVar32,local_1be0);
    local_3e30[(long)local_3f88 * 0x20 + 2] = local_1bd0._0_4_;
    local_1c00 = local_4020._0_8_;
    uStack_1bf8 = local_4020._8_8_;
    uStack_1bf0 = local_4020._16_8_;
    uStack_1be8 = local_4020._24_8_;
    local_1c04 = 3;
    local_1080[0] = 0;
    local_1080[1] = 0;
    auStack_1078[0] = 0;
    auStack_1078[1] = 0xffffffff;
    auStack_1070[0] = 0xffffffff;
    auStack_1070[1] = 0xffffffff;
    auStack_1068[0] = 0xffffffff;
    auStack_1068[1] = 0xffffffff;
    local_1060 = local_4020._0_8_;
    uStack_1058 = local_4020._8_8_;
    uStack_1050 = local_4020._16_8_;
    uStack_1048 = local_4020._24_8_;
    _local_1c40 = vpand_avx2(local_4020,(undefined1  [32])sse_bytemask[3]);
    auVar2 = _local_1c40;
    local_b60 = local_1c40._0_8_;
    uStack_b58 = local_1c40._8_8_;
    uStack_b50 = local_1c40._16_8_;
    uStack_b48 = uStack_1c28;
    uStack_638 = uStack_1c28;
    local_640 = local_1c40._16_8_;
    local_650 = local_1c60._0_8_;
    uStack_648 = local_1c60._8_8_;
    auVar32 = vpaddd_avx(stack0xffffffffffffe3d0,local_1c60);
    auVar28 = vpsrldq_avx(auVar32,8);
    local_1c50._0_8_ = auVar32._0_8_;
    local_1c50._8_8_ = auVar32._8_8_;
    local_1c60._0_8_ = auVar28._0_8_;
    local_1c60._8_8_ = auVar28._8_8_;
    local_660 = local_1c50._0_8_;
    uStack_658 = local_1c50._8_8_;
    local_670 = local_1c60._0_8_;
    uStack_668 = local_1c60._8_8_;
    auVar32 = vpaddd_avx(auVar32,auVar28);
    local_1c60 = vpsrldq_avx(auVar32,4);
    local_1c50._0_8_ = auVar32._0_8_;
    local_1c50._8_8_ = auVar32._8_8_;
    local_680 = local_1c50._0_8_;
    uStack_678 = local_1c50._8_8_;
    local_690 = local_1c60._0_8_;
    uStack_688 = local_1c60._8_8_;
    local_1c50 = vpaddd_avx(auVar32,local_1c60);
    local_3e30[(long)local_3f88 * 0x20 + 3] = local_1c50._0_4_;
    local_3f88 = local_3f88 + 1;
    _local_1c40 = auVar2;
    _local_1bc0 = auVar3;
    _local_1b40 = auVar22;
    _local_1ac0 = auVar19;
  }
  local_2e20 = in_XMM2_Qa;
  local_2e18 = in_XMM1_Qa;
  for (local_3ee4 = 4; local_3ee4 < in_R8D + -4; local_3ee4 = local_3ee4 + 4) {
    local_3ef0 = (undefined1 (*) [32])(count + (long)local_3ee4 * 2);
    for (local_4028 = 2; local_4028 < 5; local_4028 = local_4028 + 1) {
      local_1808 = local_3ef0;
      uVar4 = *(undefined8 *)(*local_3ef0 + 8);
      uVar5 = *(undefined8 *)(*local_3ef0 + 0x10);
      uVar6 = *(undefined8 *)(*local_3ef0 + 0x18);
      lVar24 = (long)local_4028;
      local_3ee0[lVar24 * 4] = *(undefined8 *)*local_3ef0;
      local_3ee0[lVar24 * 4 + 1] = uVar4;
      local_3ee0[lVar24 * 4 + 2] = uVar5;
      *(undefined8 *)(local_3ec0 + lVar24 * 0x20 + -8) = uVar6;
      local_3ef0 = (undefined1 (*) [32])(local_3ef0[4] + 0x10);
    }
    local_3ee0[0] = local_3ea0[0];
    local_3ee0[1] = local_3ea0[1];
    local_3ee0[2] = local_3ea0[2];
    local_3ee0[3] = local_3ea0[3];
    local_3ec0._8_8_ = local_3ea0[1];
    local_3ec0._0_8_ = local_3ea0[0];
    local_3ec0._16_8_ = local_3ea0[2];
    local_3ec0._24_8_ = local_3ea0[3];
    local_402c = 0;
    while( true ) {
      if (in_R9D + -3 <= local_402c) break;
      local_2680 = local_3ee0[0];
      uStack_2678 = local_3ee0[1];
      uStack_2670 = local_3ee0[2];
      uStack_2668 = local_3ee0[3];
      local_26a0 = local_3ec0._0_8_;
      uStack_2698 = local_3ec0._8_8_;
      uStack_2690 = local_3ec0._16_8_;
      uStack_2688 = local_3ec0._24_8_;
      auVar18._8_8_ = local_3ee0[1];
      auVar18._0_8_ = local_3ee0[0];
      auVar18._16_8_ = local_3ee0[2];
      auVar18._24_8_ = local_3ee0[3];
      local_4060 = vpaddd_avx2(auVar18,local_3ec0);
      local_26c0 = local_3ea0[0];
      uStack_26b8 = local_3ea0[1];
      uStack_26b0 = local_3ea0[2];
      uStack_26a8 = local_3ea0[3];
      local_26e0 = local_3ea0[4];
      uStack_26d8 = local_3ea0[5];
      uStack_26d0 = local_3ea0[6];
      uStack_26c8 = local_3ea0[7];
      auVar17._8_8_ = local_3ea0[1];
      auVar17._0_8_ = local_3ea0[0];
      auVar17._16_8_ = local_3ea0[2];
      auVar17._24_8_ = local_3ea0[3];
      auVar16._8_8_ = local_3ea0[5];
      auVar16._0_8_ = local_3ea0[4];
      auVar16._16_8_ = local_3ea0[6];
      auVar16._24_8_ = local_3ea0[7];
      local_4080 = vpaddd_avx2(auVar17,auVar16);
      local_2700 = local_4060._0_8_;
      uStack_26f8 = local_4060._8_8_;
      uStack_26f0 = local_4060._16_8_;
      uStack_26e8 = local_4060._24_8_;
      local_2720 = local_4080._0_8_;
      uStack_2718 = local_4080._8_8_;
      uStack_2710 = local_4080._16_8_;
      uStack_2708 = local_4080._24_8_;
      local_40a0 = vpaddd_avx2(local_4060,local_4080);
      local_2740 = local_40a0._0_8_;
      uStack_2738 = local_40a0._8_8_;
      uStack_2730 = local_40a0._16_8_;
      uStack_2728 = local_40a0._24_8_;
      local_2760 = local_3e60._0_8_;
      uStack_2758 = local_3e60._8_8_;
      uStack_2750 = local_3e60._16_8_;
      uStack_2748 = local_3e60._24_8_;
      local_40c0 = vpaddd_avx2(local_40a0,local_3e60);
      for (local_40c4 = 0; local_40c4 < 4; local_40c4 = local_40c4 + 1) {
        lVar24 = (long)(local_40c4 + 1);
        uVar4 = local_3ee0[lVar24 * 4 + 1];
        uVar5 = local_3ee0[lVar24 * 4 + 2];
        uVar6 = *(undefined8 *)(local_3ec0 + lVar24 * 0x20 + -8);
        lVar26 = (long)local_40c4;
        local_3ee0[lVar26 * 4] = local_3ee0[lVar24 * 4];
        local_3ee0[lVar26 * 4 + 1] = uVar4;
        local_3ee0[lVar26 * 4 + 2] = uVar5;
        *(undefined8 *)(local_3ec0 + lVar26 * 0x20 + -8) = uVar6;
      }
      local_1810 = local_3ef0;
      local_3e60._0_8_ = *(undefined8 *)*local_3ef0;
      local_3e60._8_8_ = *(undefined8 *)(*local_3ef0 + 8);
      local_3e60._16_8_ = *(undefined8 *)(*local_3ef0 + 0x10);
      local_3e60._24_8_ = *(undefined8 *)(*local_3ef0 + 0x18);
      local_3e60 = *local_3ef0;
      local_3ef0 = (undefined1 (*) [32])(local_3ef0[4] + 0x10);
      local_1c80 = local_40c0._0_8_;
      uStack_1c78 = local_40c0._8_8_;
      uStack_1c70 = local_40c0._16_8_;
      uStack_1c68 = local_40c0._24_8_;
      local_1c84 = 0;
      local_1040[0] = 0xffffffff;
      local_1040[1] = 0xffffffff;
      auStack_1038[0] = 0xffffffff;
      auStack_1038[1] = 0xffffffff;
      auStack_1030[0] = 0xffffffff;
      auStack_1030[1] = 0;
      auStack_1028[0] = 0;
      auStack_1028[1] = 0;
      local_1020 = local_40c0._0_8_;
      uStack_1018 = local_40c0._8_8_;
      uStack_1010 = local_40c0._16_8_;
      uStack_1008 = local_40c0._24_8_;
      _local_1cc0 = vpand_avx2(local_40c0,(undefined1  [32])sse_bytemask[0]);
      local_b40 = local_1cc0._0_8_;
      uStack_b38 = local_1cc0._8_8_;
      uStack_b30 = local_1cc0._16_8_;
      uStack_b28 = uStack_1ca8;
      uStack_5d8 = uStack_1ca8;
      local_5e0 = local_1cc0._16_8_;
      local_5f0 = local_1ce0._0_8_;
      uStack_5e8 = local_1ce0._8_8_;
      auVar32 = vpaddd_avx(stack0xffffffffffffe350,local_1ce0);
      auVar28 = vpsrldq_avx(auVar32,8);
      local_1cd0._0_8_ = auVar32._0_8_;
      local_1cd0._8_8_ = auVar32._8_8_;
      local_1ce0._0_8_ = auVar28._0_8_;
      local_1ce0._8_8_ = auVar28._8_8_;
      local_600 = local_1cd0._0_8_;
      uStack_5f8 = local_1cd0._8_8_;
      local_610 = local_1ce0._0_8_;
      uStack_608 = local_1ce0._8_8_;
      auVar32 = vpaddd_avx(auVar32,auVar28);
      local_1ce0 = vpsrldq_avx(auVar32,4);
      local_1cd0._0_8_ = auVar32._0_8_;
      local_1cd0._8_8_ = auVar32._8_8_;
      local_620 = local_1cd0._0_8_;
      uStack_618 = local_1cd0._8_8_;
      local_630 = local_1ce0._0_8_;
      uStack_628 = local_1ce0._8_8_;
      local_1cd0 = vpaddd_avx(auVar32,local_1ce0);
      local_3e30[(long)local_402c * 0x20 + (long)local_3ee4] = local_1cd0._0_4_;
      local_1d00 = local_40c0._0_8_;
      uStack_1cf8 = local_40c0._8_8_;
      uStack_1cf0 = local_40c0._16_8_;
      uStack_1ce8 = local_40c0._24_8_;
      local_1d04 = 1;
      local_1000[0] = 0;
      local_1000[1] = 0xffffffff;
      auStack_ff8[0] = 0xffffffff;
      auStack_ff8[1] = 0xffffffff;
      auStack_ff0[0] = 0xffffffff;
      auStack_ff0[1] = 0xffffffff;
      auStack_fe8[0] = 0;
      auStack_fe8[1] = 0;
      local_fe0 = local_40c0._0_8_;
      uStack_fd8 = local_40c0._8_8_;
      uStack_fd0 = local_40c0._16_8_;
      uStack_fc8 = local_40c0._24_8_;
      _local_1d40 = vpand_avx2(local_40c0,(undefined1  [32])sse_bytemask[1]);
      local_b20 = local_1d40._0_8_;
      uStack_b18 = local_1d40._8_8_;
      uStack_b10 = local_1d40._16_8_;
      uStack_b08 = uStack_1d28;
      uStack_578 = uStack_1d28;
      local_580 = local_1d40._16_8_;
      local_590 = local_1d60._0_8_;
      uStack_588 = local_1d60._8_8_;
      auVar32 = vpaddd_avx(stack0xffffffffffffe2d0,local_1d60);
      auVar28 = vpsrldq_avx(auVar32,8);
      local_1d50._0_8_ = auVar32._0_8_;
      local_1d50._8_8_ = auVar32._8_8_;
      local_1d60._0_8_ = auVar28._0_8_;
      local_1d60._8_8_ = auVar28._8_8_;
      local_5a0 = local_1d50._0_8_;
      uStack_598 = local_1d50._8_8_;
      local_5b0 = local_1d60._0_8_;
      uStack_5a8 = local_1d60._8_8_;
      auVar32 = vpaddd_avx(auVar32,auVar28);
      local_1d60 = vpsrldq_avx(auVar32,4);
      local_1d50._0_8_ = auVar32._0_8_;
      local_1d50._8_8_ = auVar32._8_8_;
      local_5c0 = local_1d50._0_8_;
      uStack_5b8 = local_1d50._8_8_;
      local_5d0 = local_1d60._0_8_;
      uStack_5c8 = local_1d60._8_8_;
      local_1d50 = vpaddd_avx(auVar32,local_1d60);
      local_3e30[(long)local_402c * 0x20 + (long)local_3ee4 + 1] = local_1d50._0_4_;
      local_1d80 = local_40c0._0_8_;
      uStack_1d78 = local_40c0._8_8_;
      uStack_1d70 = local_40c0._16_8_;
      uStack_1d68 = local_40c0._24_8_;
      local_1d84 = 2;
      local_fc0[0] = 0;
      local_fc0[1] = 0;
      auStack_fb8[0] = 0xffffffff;
      auStack_fb8[1] = 0xffffffff;
      auStack_fb0[0] = 0xffffffff;
      auStack_fb0[1] = 0xffffffff;
      auStack_fa8[0] = 0xffffffff;
      auStack_fa8[1] = 0;
      local_fa0 = local_40c0._0_8_;
      uStack_f98 = local_40c0._8_8_;
      uStack_f90 = local_40c0._16_8_;
      uStack_f88 = local_40c0._24_8_;
      _local_1dc0 = vpand_avx2(local_40c0,(undefined1  [32])sse_bytemask[2]);
      local_b00 = local_1dc0._0_8_;
      uStack_af8 = local_1dc0._8_8_;
      uStack_af0 = local_1dc0._16_8_;
      uStack_ae8 = uStack_1da8;
      uStack_518 = uStack_1da8;
      local_520 = local_1dc0._16_8_;
      local_530 = local_1de0._0_8_;
      uStack_528 = local_1de0._8_8_;
      auVar32 = vpaddd_avx(stack0xffffffffffffe250,local_1de0);
      auVar28 = vpsrldq_avx(auVar32,8);
      local_1dd0._0_8_ = auVar32._0_8_;
      local_1dd0._8_8_ = auVar32._8_8_;
      local_1de0._0_8_ = auVar28._0_8_;
      local_1de0._8_8_ = auVar28._8_8_;
      local_540 = local_1dd0._0_8_;
      uStack_538 = local_1dd0._8_8_;
      local_550 = local_1de0._0_8_;
      uStack_548 = local_1de0._8_8_;
      auVar32 = vpaddd_avx(auVar32,auVar28);
      local_1de0 = vpsrldq_avx(auVar32,4);
      local_1dd0._0_8_ = auVar32._0_8_;
      local_1dd0._8_8_ = auVar32._8_8_;
      local_560 = local_1dd0._0_8_;
      uStack_558 = local_1dd0._8_8_;
      local_570 = local_1de0._0_8_;
      uStack_568 = local_1de0._8_8_;
      local_1dd0 = vpaddd_avx(auVar32,local_1de0);
      local_3e30[(long)local_402c * 0x20 + (long)local_3ee4 + 2] = local_1dd0._0_4_;
      local_1e00 = local_40c0._0_8_;
      uStack_1df8 = local_40c0._8_8_;
      uStack_1df0 = local_40c0._16_8_;
      uStack_1de8 = local_40c0._24_8_;
      local_1e04 = 3;
      local_f80[0] = 0;
      local_f80[1] = 0;
      auStack_f78[0] = 0;
      auStack_f78[1] = 0xffffffff;
      auStack_f70[0] = 0xffffffff;
      auStack_f70[1] = 0xffffffff;
      auStack_f68[0] = 0xffffffff;
      auStack_f68[1] = 0xffffffff;
      local_f60 = local_40c0._0_8_;
      uStack_f58 = local_40c0._8_8_;
      uStack_f50 = local_40c0._16_8_;
      uStack_f48 = local_40c0._24_8_;
      _local_1e40 = vpand_avx2(local_40c0,(undefined1  [32])sse_bytemask[3]);
      local_ae0 = local_1e40._0_8_;
      uStack_ad8 = local_1e40._8_8_;
      uStack_ad0 = local_1e40._16_8_;
      uStack_ac8 = uStack_1e28;
      uStack_4b8 = uStack_1e28;
      local_4c0 = local_1e40._16_8_;
      local_4d0 = local_1e60._0_8_;
      uStack_4c8 = local_1e60._8_8_;
      auVar32 = vpaddd_avx(stack0xffffffffffffe1d0,local_1e60);
      auVar28 = vpsrldq_avx(auVar32,8);
      local_1e50._0_8_ = auVar32._0_8_;
      local_1e50._8_8_ = auVar32._8_8_;
      local_1e60._0_8_ = auVar28._0_8_;
      local_1e60._8_8_ = auVar28._8_8_;
      local_4e0 = local_1e50._0_8_;
      uStack_4d8 = local_1e50._8_8_;
      local_4f0 = local_1e60._0_8_;
      uStack_4e8 = local_1e60._8_8_;
      auVar32 = vpaddd_avx(auVar32,auVar28);
      local_1e60 = vpsrldq_avx(auVar32,4);
      local_1e50._0_8_ = auVar32._0_8_;
      local_1e50._8_8_ = auVar32._8_8_;
      local_500 = local_1e50._0_8_;
      uStack_4f8 = local_1e50._8_8_;
      local_510 = local_1e60._0_8_;
      uStack_508 = local_1e60._8_8_;
      local_1e50 = vpaddd_avx(auVar32,local_1e60);
      local_3e30[(long)local_402c * 0x20 + (long)(local_3ee4 + 3)] = local_1e50._0_4_;
      local_402c = local_402c + 1;
    }
    local_40c8 = in_R9D + -3;
    while( true ) {
      if (in_R9D <= local_40c8) break;
      local_2780 = local_3ee0[0];
      uStack_2778 = local_3ee0[1];
      uStack_2770 = local_3ee0[2];
      uStack_2768 = local_3ee0[3];
      local_27a0 = local_3ec0._0_8_;
      uStack_2798 = local_3ec0._8_8_;
      uStack_2790 = local_3ec0._16_8_;
      uStack_2788 = local_3ec0._24_8_;
      auVar15._8_8_ = local_3ee0[1];
      auVar15._0_8_ = local_3ee0[0];
      auVar15._16_8_ = local_3ee0[2];
      auVar15._24_8_ = local_3ee0[3];
      local_4100 = vpaddd_avx2(auVar15,local_3ec0);
      local_27c0 = local_3ea0[0];
      uStack_27b8 = local_3ea0[1];
      uStack_27b0 = local_3ea0[2];
      uStack_27a8 = local_3ea0[3];
      local_27e0 = local_3ea0[4];
      uStack_27d8 = local_3ea0[5];
      uStack_27d0 = local_3ea0[6];
      uStack_27c8 = local_3ea0[7];
      auVar14._8_8_ = local_3ea0[1];
      auVar14._0_8_ = local_3ea0[0];
      auVar14._16_8_ = local_3ea0[2];
      auVar14._24_8_ = local_3ea0[3];
      auVar13._8_8_ = local_3ea0[5];
      auVar13._0_8_ = local_3ea0[4];
      auVar13._16_8_ = local_3ea0[6];
      auVar13._24_8_ = local_3ea0[7];
      local_4120 = vpaddd_avx2(auVar14,auVar13);
      local_2800 = local_4100._0_8_;
      uStack_27f8 = local_4100._8_8_;
      uStack_27f0 = local_4100._16_8_;
      uStack_27e8 = local_4100._24_8_;
      local_2820 = local_4120._0_8_;
      uStack_2818 = local_4120._8_8_;
      uStack_2810 = local_4120._16_8_;
      uStack_2808 = local_4120._24_8_;
      local_4140 = vpaddd_avx2(local_4100,local_4120);
      local_2840 = local_4140._0_8_;
      uStack_2838 = local_4140._8_8_;
      uStack_2830 = local_4140._16_8_;
      uStack_2828 = local_4140._24_8_;
      local_2860 = local_3e60._0_8_;
      uStack_2858 = local_3e60._8_8_;
      uStack_2850 = local_3e60._16_8_;
      uStack_2848 = local_3e60._24_8_;
      local_4160 = vpaddd_avx2(local_4140,local_3e60);
      for (local_4164 = 0; local_4164 < 4; local_4164 = local_4164 + 1) {
        lVar24 = (long)(local_4164 + 1);
        uVar4 = local_3ee0[lVar24 * 4 + 1];
        uVar5 = local_3ee0[lVar24 * 4 + 2];
        uVar6 = *(undefined8 *)(local_3ec0 + lVar24 * 0x20 + -8);
        lVar26 = (long)local_4164;
        local_3ee0[lVar26 * 4] = local_3ee0[lVar24 * 4];
        local_3ee0[lVar26 * 4 + 1] = uVar4;
        local_3ee0[lVar26 * 4 + 2] = uVar5;
        *(undefined8 *)(local_3ec0 + lVar26 * 0x20 + -8) = uVar6;
      }
      local_1e80 = local_4160._0_8_;
      uStack_1e78 = local_4160._8_8_;
      uStack_1e70 = local_4160._16_8_;
      uStack_1e68 = local_4160._24_8_;
      local_1e84 = 0;
      local_f40[0] = 0xffffffff;
      local_f40[1] = 0xffffffff;
      auStack_f38[0] = 0xffffffff;
      auStack_f38[1] = 0xffffffff;
      auStack_f30[0] = 0xffffffff;
      auStack_f30[1] = 0;
      auStack_f28[0] = 0;
      auStack_f28[1] = 0;
      local_f20 = local_4160._0_8_;
      uStack_f18 = local_4160._8_8_;
      uStack_f10 = local_4160._16_8_;
      uStack_f08 = local_4160._24_8_;
      _local_1ec0 = vpand_avx2(local_4160,(undefined1  [32])sse_bytemask[0]);
      local_ac0 = local_1ec0._0_8_;
      uStack_ab8 = local_1ec0._8_8_;
      uStack_ab0 = local_1ec0._16_8_;
      uStack_aa8 = uStack_1ea8;
      uStack_458 = uStack_1ea8;
      local_460 = local_1ec0._16_8_;
      local_470 = local_1ee0._0_8_;
      uStack_468 = local_1ee0._8_8_;
      auVar32 = vpaddd_avx(stack0xffffffffffffe150,local_1ee0);
      auVar28 = vpsrldq_avx(auVar32,8);
      local_1ed0._0_8_ = auVar32._0_8_;
      local_1ed0._8_8_ = auVar32._8_8_;
      local_1ee0._0_8_ = auVar28._0_8_;
      local_1ee0._8_8_ = auVar28._8_8_;
      local_480 = local_1ed0._0_8_;
      uStack_478 = local_1ed0._8_8_;
      local_490 = local_1ee0._0_8_;
      uStack_488 = local_1ee0._8_8_;
      auVar32 = vpaddd_avx(auVar32,auVar28);
      local_1ee0 = vpsrldq_avx(auVar32,4);
      local_1ed0._0_8_ = auVar32._0_8_;
      local_1ed0._8_8_ = auVar32._8_8_;
      local_4a0 = local_1ed0._0_8_;
      uStack_498 = local_1ed0._8_8_;
      local_4b0 = local_1ee0._0_8_;
      uStack_4a8 = local_1ee0._8_8_;
      local_1ed0 = vpaddd_avx(auVar32,local_1ee0);
      local_3e30[(long)local_40c8 * 0x20 + (long)local_3ee4] = local_1ed0._0_4_;
      local_1f00 = local_4160._0_8_;
      uStack_1ef8 = local_4160._8_8_;
      uStack_1ef0 = local_4160._16_8_;
      uStack_1ee8 = local_4160._24_8_;
      local_1f04 = 1;
      local_f00[0] = 0;
      local_f00[1] = 0xffffffff;
      auStack_ef8[0] = 0xffffffff;
      auStack_ef8[1] = 0xffffffff;
      auStack_ef0[0] = 0xffffffff;
      auStack_ef0[1] = 0xffffffff;
      auStack_ee8[0] = 0;
      auStack_ee8[1] = 0;
      local_ee0 = local_4160._0_8_;
      uStack_ed8 = local_4160._8_8_;
      uStack_ed0 = local_4160._16_8_;
      uStack_ec8 = local_4160._24_8_;
      _local_1f40 = vpand_avx2(local_4160,(undefined1  [32])sse_bytemask[1]);
      local_aa0 = local_1f40._0_8_;
      uStack_a98 = local_1f40._8_8_;
      uStack_a90 = local_1f40._16_8_;
      uStack_a88 = uStack_1f28;
      uStack_3f8 = uStack_1f28;
      local_400 = local_1f40._16_8_;
      local_410 = local_1f60._0_8_;
      uStack_408 = local_1f60._8_8_;
      auVar32 = vpaddd_avx(stack0xffffffffffffe0d0,local_1f60);
      auVar28 = vpsrldq_avx(auVar32,8);
      local_1f50._0_8_ = auVar32._0_8_;
      local_1f50._8_8_ = auVar32._8_8_;
      local_1f60._0_8_ = auVar28._0_8_;
      local_1f60._8_8_ = auVar28._8_8_;
      local_420 = local_1f50._0_8_;
      uStack_418 = local_1f50._8_8_;
      local_430 = local_1f60._0_8_;
      uStack_428 = local_1f60._8_8_;
      auVar32 = vpaddd_avx(auVar32,auVar28);
      local_1f60 = vpsrldq_avx(auVar32,4);
      local_1f50._0_8_ = auVar32._0_8_;
      local_1f50._8_8_ = auVar32._8_8_;
      local_440 = local_1f50._0_8_;
      uStack_438 = local_1f50._8_8_;
      local_450 = local_1f60._0_8_;
      uStack_448 = local_1f60._8_8_;
      local_1f50 = vpaddd_avx(auVar32,local_1f60);
      local_3e30[(long)local_40c8 * 0x20 + (long)local_3ee4 + 1] = local_1f50._0_4_;
      local_1f80 = local_4160._0_8_;
      uStack_1f78 = local_4160._8_8_;
      uStack_1f70 = local_4160._16_8_;
      uStack_1f68 = local_4160._24_8_;
      local_1f84 = 2;
      local_ec0[0] = 0;
      local_ec0[1] = 0;
      auStack_eb8[0] = 0xffffffff;
      auStack_eb8[1] = 0xffffffff;
      auStack_eb0[0] = 0xffffffff;
      auStack_eb0[1] = 0xffffffff;
      auStack_ea8[0] = 0xffffffff;
      auStack_ea8[1] = 0;
      local_ea0 = local_4160._0_8_;
      uStack_e98 = local_4160._8_8_;
      uStack_e90 = local_4160._16_8_;
      uStack_e88 = local_4160._24_8_;
      _local_1fc0 = vpand_avx2(local_4160,(undefined1  [32])sse_bytemask[2]);
      local_a80 = local_1fc0._0_8_;
      uStack_a78 = local_1fc0._8_8_;
      uStack_a70 = local_1fc0._16_8_;
      uStack_a68 = uStack_1fa8;
      uStack_398 = uStack_1fa8;
      local_3a0 = local_1fc0._16_8_;
      local_3b0 = local_1fe0._0_8_;
      uStack_3a8 = local_1fe0._8_8_;
      auVar32 = vpaddd_avx(stack0xffffffffffffe050,local_1fe0);
      auVar28 = vpsrldq_avx(auVar32,8);
      local_1fd0._0_8_ = auVar32._0_8_;
      local_1fd0._8_8_ = auVar32._8_8_;
      local_1fe0._0_8_ = auVar28._0_8_;
      local_1fe0._8_8_ = auVar28._8_8_;
      local_3c0 = local_1fd0._0_8_;
      uStack_3b8 = local_1fd0._8_8_;
      local_3d0 = local_1fe0._0_8_;
      uStack_3c8 = local_1fe0._8_8_;
      auVar32 = vpaddd_avx(auVar32,auVar28);
      local_1fe0 = vpsrldq_avx(auVar32,4);
      local_1fd0._0_8_ = auVar32._0_8_;
      local_1fd0._8_8_ = auVar32._8_8_;
      local_3e0 = local_1fd0._0_8_;
      uStack_3d8 = local_1fd0._8_8_;
      local_3f0 = local_1fe0._0_8_;
      uStack_3e8 = local_1fe0._8_8_;
      local_1fd0 = vpaddd_avx(auVar32,local_1fe0);
      local_3e30[(long)local_40c8 * 0x20 + (long)local_3ee4 + 2] = local_1fd0._0_4_;
      local_2000 = local_4160._0_8_;
      uStack_1ff8 = local_4160._8_8_;
      uStack_1ff0 = local_4160._16_8_;
      uStack_1fe8 = local_4160._24_8_;
      local_2004 = 3;
      local_e80[0] = 0;
      local_e80[1] = 0;
      auStack_e78[0] = 0;
      auStack_e78[1] = 0xffffffff;
      auStack_e70[0] = 0xffffffff;
      auStack_e70[1] = 0xffffffff;
      auStack_e68[0] = 0xffffffff;
      auStack_e68[1] = 0xffffffff;
      local_e60 = local_4160._0_8_;
      uStack_e58 = local_4160._8_8_;
      uStack_e50 = local_4160._16_8_;
      uStack_e48 = local_4160._24_8_;
      _local_2040 = vpand_avx2(local_4160,(undefined1  [32])sse_bytemask[3]);
      local_a60 = local_2040._0_8_;
      uStack_a58 = local_2040._8_8_;
      uStack_a50 = local_2040._16_8_;
      uStack_a48 = uStack_2028;
      uStack_338 = uStack_2028;
      local_340 = local_2040._16_8_;
      local_350 = local_2060._0_8_;
      uStack_348 = local_2060._8_8_;
      auVar32 = vpaddd_avx(stack0xffffffffffffdfd0,local_2060);
      auVar28 = vpsrldq_avx(auVar32,8);
      local_2050._0_8_ = auVar32._0_8_;
      local_2050._8_8_ = auVar32._8_8_;
      local_2060._0_8_ = auVar28._0_8_;
      local_2060._8_8_ = auVar28._8_8_;
      local_360 = local_2050._0_8_;
      uStack_358 = local_2050._8_8_;
      local_370 = local_2060._0_8_;
      uStack_368 = local_2060._8_8_;
      auVar32 = vpaddd_avx(auVar32,auVar28);
      local_2060 = vpsrldq_avx(auVar32,4);
      local_2050._0_8_ = auVar32._0_8_;
      local_2050._8_8_ = auVar32._8_8_;
      local_380 = local_2050._0_8_;
      uStack_378 = local_2050._8_8_;
      local_390 = local_2060._0_8_;
      uStack_388 = local_2060._8_8_;
      local_2050 = vpaddd_avx(auVar32,local_2060);
      local_3e30[(long)local_40c8 * 0x20 + (long)(local_3ee4 + 3)] = local_2050._0_4_;
      local_40c8 = local_40c8 + 1;
    }
  }
  local_3ef0 = (undefined1 (*) [32])(count + (long)local_3ee4 * 2);
  for (local_4168 = 2; local_4168 < 5; local_4168 = local_4168 + 1) {
    lVar24 = (long)local_4168;
    local_17a0 = (undefined1 (*) [32])(local_3ee0 + lVar24 * 4);
    local_1798 = local_3ef0;
    local_1790 = local_3ef0;
    uVar4 = *(undefined8 *)(*local_3ef0 + 8);
    uVar5 = *(undefined8 *)(*local_3ef0 + 0x10);
    uVar6 = *(undefined8 *)(*local_3ef0 + 0x18);
    *(undefined8 *)*local_17a0 = *(undefined8 *)*local_3ef0;
    local_3ee0[lVar24 * 4 + 1] = uVar4;
    local_3ee0[lVar24 * 4 + 2] = uVar5;
    *(undefined8 *)(local_3ec0 + lVar24 * 0x20 + -8) = uVar6;
    local_17c0 = vpshufd_avx2(*local_17a0,0x54);
    auVar31._0_16_ = ZEXT116(0) * local_17c0._16_16_ + ZEXT116(1) * SUB3216(*local_17a0,0);
    auVar31._16_16_ = ZEXT116(0) * SUB3216(*local_17a0,0x10) + ZEXT116(1) * local_17c0._16_16_;
    *local_17a0 = auVar31;
    local_3ef0 = (undefined1 (*) [32])(local_3ef0[4] + 0x10);
  }
  local_3ee0[0] = local_3ea0[0];
  local_3ee0[1] = local_3ea0[1];
  local_3ee0[2] = local_3ea0[2];
  local_3ee0[3] = local_3ea0[3];
  local_3ec0._8_8_ = local_3ea0[1];
  local_3ec0._0_8_ = local_3ea0[0];
  local_3ec0._16_8_ = local_3ea0[2];
  local_3ec0._24_8_ = local_3ea0[3];
  local_416c = 0;
  while( true ) {
    if (in_R9D + -3 <= local_416c) break;
    local_2880 = local_3ee0[0];
    uStack_2878 = local_3ee0[1];
    uStack_2870 = local_3ee0[2];
    uStack_2868 = local_3ee0[3];
    local_28a0 = local_3ec0._0_8_;
    uStack_2898 = local_3ec0._8_8_;
    uStack_2890 = local_3ec0._16_8_;
    uStack_2888 = local_3ec0._24_8_;
    auVar12._8_8_ = local_3ee0[1];
    auVar12._0_8_ = local_3ee0[0];
    auVar12._16_8_ = local_3ee0[2];
    auVar12._24_8_ = local_3ee0[3];
    local_41a0 = vpaddd_avx2(auVar12,local_3ec0);
    local_28c0 = local_3ea0[0];
    uStack_28b8 = local_3ea0[1];
    uStack_28b0 = local_3ea0[2];
    uStack_28a8 = local_3ea0[3];
    local_28e0 = local_3ea0[4];
    uStack_28d8 = local_3ea0[5];
    uStack_28d0 = local_3ea0[6];
    uStack_28c8 = local_3ea0[7];
    auVar11._8_8_ = local_3ea0[1];
    auVar11._0_8_ = local_3ea0[0];
    auVar11._16_8_ = local_3ea0[2];
    auVar11._24_8_ = local_3ea0[3];
    auVar10._8_8_ = local_3ea0[5];
    auVar10._0_8_ = local_3ea0[4];
    auVar10._16_8_ = local_3ea0[6];
    auVar10._24_8_ = local_3ea0[7];
    local_41c0 = vpaddd_avx2(auVar11,auVar10);
    local_2900 = local_41a0._0_8_;
    uStack_28f8 = local_41a0._8_8_;
    uStack_28f0 = local_41a0._16_8_;
    uStack_28e8 = local_41a0._24_8_;
    local_2920 = local_41c0._0_8_;
    uStack_2918 = local_41c0._8_8_;
    uStack_2910 = local_41c0._16_8_;
    uStack_2908 = local_41c0._24_8_;
    local_41e0 = vpaddd_avx2(local_41a0,local_41c0);
    local_2940 = local_41e0._0_8_;
    uStack_2938 = local_41e0._8_8_;
    uStack_2930 = local_41e0._16_8_;
    uStack_2928 = local_41e0._24_8_;
    local_2960 = local_3e60._0_8_;
    uStack_2958 = local_3e60._8_8_;
    uStack_2950 = local_3e60._16_8_;
    uStack_2948 = local_3e60._24_8_;
    local_4200 = vpaddd_avx2(local_41e0,local_3e60);
    for (local_4204 = 0; local_4204 < 4; local_4204 = local_4204 + 1) {
      lVar24 = (long)(local_4204 + 1);
      uVar4 = local_3ee0[lVar24 * 4 + 1];
      uVar5 = local_3ee0[lVar24 * 4 + 2];
      uVar6 = *(undefined8 *)(local_3ec0 + lVar24 * 0x20 + -8);
      lVar26 = (long)local_4204;
      local_3ee0[lVar26 * 4] = local_3ee0[lVar24 * 4];
      local_3ee0[lVar26 * 4 + 1] = uVar4;
      local_3ee0[lVar26 * 4 + 2] = uVar5;
      *(undefined8 *)(local_3ec0 + lVar26 * 0x20 + -8) = uVar6;
    }
    local_17d8 = local_3e60;
    local_17d0 = local_3ef0;
    local_17c8 = local_3ef0;
    local_1800._0_32_ = vpshufd_avx2(*local_3ef0,0x54);
    local_3e60._0_16_ =
         ZEXT116(0) * local_1800._16_16_ + ZEXT116(1) * SUB2416(*(undefined1 (*) [24])*local_3ef0,0)
    ;
    local_3e60._16_16_ = ZEXT116(0) * SUB3216(*local_3ef0,0x10) + ZEXT116(1) * local_1800._16_16_;
    local_3ef0 = (undefined1 (*) [32])(local_3ef0[4] + 0x10);
    local_2080 = local_4200._0_8_;
    uStack_2078 = local_4200._8_8_;
    uStack_2070 = local_4200._16_8_;
    uStack_2068 = local_4200._24_8_;
    local_2084 = 0;
    local_e40[0] = 0xffffffff;
    local_e40[1] = 0xffffffff;
    auStack_e38[0] = 0xffffffff;
    auStack_e38[1] = 0xffffffff;
    auStack_e30[0] = 0xffffffff;
    auStack_e30[1] = 0;
    auStack_e28[0] = 0;
    auStack_e28[1] = 0;
    local_e20 = local_4200._0_8_;
    uStack_e18 = local_4200._8_8_;
    uStack_e10 = local_4200._16_8_;
    uStack_e08 = local_4200._24_8_;
    _local_20c0 = vpand_avx2(local_4200,(undefined1  [32])sse_bytemask[0]);
    local_a40 = local_20c0._0_8_;
    uStack_a38 = local_20c0._8_8_;
    uStack_a30 = local_20c0._16_8_;
    uStack_a28 = uStack_20a8;
    uStack_2d8 = uStack_20a8;
    local_2e0 = local_20c0._16_8_;
    local_2f0 = local_20e0._0_8_;
    uStack_2e8 = local_20e0._8_8_;
    auVar32 = vpaddd_avx(stack0xffffffffffffdf50,local_20e0);
    auVar28 = vpsrldq_avx(auVar32,8);
    local_20d0._0_8_ = auVar32._0_8_;
    local_20d0._8_8_ = auVar32._8_8_;
    local_20e0._0_8_ = auVar28._0_8_;
    local_20e0._8_8_ = auVar28._8_8_;
    local_300 = local_20d0._0_8_;
    uStack_2f8 = local_20d0._8_8_;
    local_310 = local_20e0._0_8_;
    uStack_308 = local_20e0._8_8_;
    auVar32 = vpaddd_avx(auVar32,auVar28);
    local_20e0 = vpsrldq_avx(auVar32,4);
    local_20d0._0_8_ = auVar32._0_8_;
    local_20d0._8_8_ = auVar32._8_8_;
    local_320 = local_20d0._0_8_;
    uStack_318 = local_20d0._8_8_;
    local_330 = local_20e0._0_8_;
    uStack_328 = local_20e0._8_8_;
    local_20d0 = vpaddd_avx(auVar32,local_20e0);
    local_3e30[(long)local_416c * 0x20 + (long)local_3ee4] = local_20d0._0_4_;
    local_2100 = local_4200._0_8_;
    uStack_20f8 = local_4200._8_8_;
    uStack_20f0 = local_4200._16_8_;
    uStack_20e8 = local_4200._24_8_;
    local_2104 = 1;
    local_e00[0] = 0;
    local_e00[1] = 0xffffffff;
    auStack_df8[0] = 0xffffffff;
    auStack_df8[1] = 0xffffffff;
    auStack_df0[0] = 0xffffffff;
    auStack_df0[1] = 0xffffffff;
    auStack_de8[0] = 0;
    auStack_de8[1] = 0;
    local_de0 = local_4200._0_8_;
    uStack_dd8 = local_4200._8_8_;
    uStack_dd0 = local_4200._16_8_;
    uStack_dc8 = local_4200._24_8_;
    _local_2140 = vpand_avx2(local_4200,(undefined1  [32])sse_bytemask[1]);
    local_a20 = local_2140._0_8_;
    uStack_a18 = local_2140._8_8_;
    uStack_a10 = local_2140._16_8_;
    uStack_a08 = uStack_2128;
    uStack_278 = uStack_2128;
    local_280 = local_2140._16_8_;
    local_290 = local_2160._0_8_;
    uStack_288 = local_2160._8_8_;
    auVar32 = vpaddd_avx(stack0xffffffffffffded0,local_2160);
    auVar28 = vpsrldq_avx(auVar32,8);
    local_2150._0_8_ = auVar32._0_8_;
    local_2150._8_8_ = auVar32._8_8_;
    local_2160._0_8_ = auVar28._0_8_;
    local_2160._8_8_ = auVar28._8_8_;
    local_2a0 = local_2150._0_8_;
    uStack_298 = local_2150._8_8_;
    local_2b0 = local_2160._0_8_;
    uStack_2a8 = local_2160._8_8_;
    auVar32 = vpaddd_avx(auVar32,auVar28);
    local_2160 = vpsrldq_avx(auVar32,4);
    local_2150._0_8_ = auVar32._0_8_;
    local_2150._8_8_ = auVar32._8_8_;
    local_2c0 = local_2150._0_8_;
    uStack_2b8 = local_2150._8_8_;
    local_2d0 = local_2160._0_8_;
    uStack_2c8 = local_2160._8_8_;
    local_2150 = vpaddd_avx(auVar32,local_2160);
    local_3e30[(long)local_416c * 0x20 + (long)local_3ee4 + 1] = local_2150._0_4_;
    local_2180 = local_4200._0_8_;
    uStack_2178 = local_4200._8_8_;
    uStack_2170 = local_4200._16_8_;
    uStack_2168 = local_4200._24_8_;
    local_2184 = 2;
    local_dc0[0] = 0;
    local_dc0[1] = 0;
    auStack_db8[0] = 0xffffffff;
    auStack_db8[1] = 0xffffffff;
    auStack_db0[0] = 0xffffffff;
    auStack_db0[1] = 0xffffffff;
    auStack_da8[0] = 0xffffffff;
    auStack_da8[1] = 0;
    local_da0 = local_4200._0_8_;
    uStack_d98 = local_4200._8_8_;
    uStack_d90 = local_4200._16_8_;
    uStack_d88 = local_4200._24_8_;
    _local_21c0 = vpand_avx2(local_4200,(undefined1  [32])sse_bytemask[2]);
    local_a00 = local_21c0._0_8_;
    uStack_9f8 = local_21c0._8_8_;
    uStack_9f0 = local_21c0._16_8_;
    uStack_9e8 = uStack_21a8;
    uStack_218 = uStack_21a8;
    local_220 = local_21c0._16_8_;
    local_230 = local_21e0._0_8_;
    uStack_228 = local_21e0._8_8_;
    auVar32 = vpaddd_avx(stack0xffffffffffffde50,local_21e0);
    auVar28 = vpsrldq_avx(auVar32,8);
    local_21d0._0_8_ = auVar32._0_8_;
    local_21d0._8_8_ = auVar32._8_8_;
    local_21e0._0_8_ = auVar28._0_8_;
    local_21e0._8_8_ = auVar28._8_8_;
    local_240 = local_21d0._0_8_;
    uStack_238 = local_21d0._8_8_;
    local_250 = local_21e0._0_8_;
    uStack_248 = local_21e0._8_8_;
    auVar32 = vpaddd_avx(auVar32,auVar28);
    local_21e0 = vpsrldq_avx(auVar32,4);
    local_21d0._0_8_ = auVar32._0_8_;
    local_21d0._8_8_ = auVar32._8_8_;
    local_260 = local_21d0._0_8_;
    uStack_258 = local_21d0._8_8_;
    local_270 = local_21e0._0_8_;
    uStack_268 = local_21e0._8_8_;
    local_21d0 = vpaddd_avx(auVar32,local_21e0);
    local_3e30[(long)local_416c * 0x20 + (long)local_3ee4 + 2] = local_21d0._0_4_;
    local_2200 = local_4200._0_8_;
    uStack_21f8 = local_4200._8_8_;
    uStack_21f0 = local_4200._16_8_;
    uStack_21e8 = local_4200._24_8_;
    local_2204 = 3;
    local_d80[0] = 0;
    local_d80[1] = 0;
    auStack_d78[0] = 0;
    auStack_d78[1] = 0xffffffff;
    auStack_d70[0] = 0xffffffff;
    auStack_d70[1] = 0xffffffff;
    auStack_d68[0] = 0xffffffff;
    auStack_d68[1] = 0xffffffff;
    local_d60 = local_4200._0_8_;
    uStack_d58 = local_4200._8_8_;
    uStack_d50 = local_4200._16_8_;
    uStack_d48 = local_4200._24_8_;
    _local_2240 = vpand_avx2(local_4200,(undefined1  [32])sse_bytemask[3]);
    local_9e0 = local_2240._0_8_;
    uStack_9d8 = local_2240._8_8_;
    uStack_9d0 = local_2240._16_8_;
    uStack_9c8 = uStack_2228;
    uStack_1b8 = uStack_2228;
    local_1c0 = local_2240._16_8_;
    local_1d0 = local_2260._0_8_;
    uStack_1c8 = local_2260._8_8_;
    auVar32 = vpaddd_avx(stack0xffffffffffffddd0,local_2260);
    auVar28 = vpsrldq_avx(auVar32,8);
    local_2250._0_8_ = auVar32._0_8_;
    local_2250._8_8_ = auVar32._8_8_;
    local_2260._0_8_ = auVar28._0_8_;
    local_2260._8_8_ = auVar28._8_8_;
    local_1e0 = local_2250._0_8_;
    uStack_1d8 = local_2250._8_8_;
    local_1f0 = local_2260._0_8_;
    uStack_1e8 = local_2260._8_8_;
    auVar32 = vpaddd_avx(auVar32,auVar28);
    local_2260 = vpsrldq_avx(auVar32,4);
    local_2250._0_8_ = auVar32._0_8_;
    local_2250._8_8_ = auVar32._8_8_;
    local_200 = local_2250._0_8_;
    uStack_1f8 = local_2250._8_8_;
    local_210 = local_2260._0_8_;
    uStack_208 = local_2260._8_8_;
    local_2250 = vpaddd_avx(auVar32,local_2260);
    local_3e30[(long)local_416c * 0x20 + (long)(local_3ee4 + 3)] = local_2250._0_4_;
    local_416c = local_416c + 1;
  }
  local_4208 = in_R9D + -3;
  while( true ) {
    if (in_R9D <= local_4208) break;
    local_2980 = local_3ee0[0];
    uStack_2978 = local_3ee0[1];
    uStack_2970 = local_3ee0[2];
    uStack_2968 = local_3ee0[3];
    local_29a0 = local_3ec0._0_8_;
    uStack_2998 = local_3ec0._8_8_;
    uStack_2990 = local_3ec0._16_8_;
    uStack_2988 = local_3ec0._24_8_;
    auVar9._8_8_ = local_3ee0[1];
    auVar9._0_8_ = local_3ee0[0];
    auVar9._16_8_ = local_3ee0[2];
    auVar9._24_8_ = local_3ee0[3];
    local_4240 = vpaddd_avx2(auVar9,local_3ec0);
    local_29c0 = local_3ea0[0];
    uStack_29b8 = local_3ea0[1];
    uStack_29b0 = local_3ea0[2];
    uStack_29a8 = local_3ea0[3];
    local_29e0 = local_3ea0[4];
    uStack_29d8 = local_3ea0[5];
    uStack_29d0 = local_3ea0[6];
    uStack_29c8 = local_3ea0[7];
    auVar8._8_8_ = local_3ea0[1];
    auVar8._0_8_ = local_3ea0[0];
    auVar8._16_8_ = local_3ea0[2];
    auVar8._24_8_ = local_3ea0[3];
    auVar7._8_8_ = local_3ea0[5];
    auVar7._0_8_ = local_3ea0[4];
    auVar7._16_8_ = local_3ea0[6];
    auVar7._24_8_ = local_3ea0[7];
    local_4260 = vpaddd_avx2(auVar8,auVar7);
    local_2a00 = local_4240._0_8_;
    uStack_29f8 = local_4240._8_8_;
    uStack_29f0 = local_4240._16_8_;
    uStack_29e8 = local_4240._24_8_;
    local_2a20 = local_4260._0_8_;
    uStack_2a18 = local_4260._8_8_;
    uStack_2a10 = local_4260._16_8_;
    uStack_2a08 = local_4260._24_8_;
    local_4280 = vpaddd_avx2(local_4240,local_4260);
    local_2a40 = local_4280._0_8_;
    uStack_2a38 = local_4280._8_8_;
    uStack_2a30 = local_4280._16_8_;
    uStack_2a28 = local_4280._24_8_;
    local_2a60 = local_3e60._0_8_;
    uStack_2a58 = local_3e60._8_8_;
    uStack_2a50 = local_3e60._16_8_;
    uStack_2a48 = local_3e60._24_8_;
    local_42a0 = vpaddd_avx2(local_4280,local_3e60);
    for (local_42a4 = 0; local_42a4 < 4; local_42a4 = local_42a4 + 1) {
      lVar24 = (long)(local_42a4 + 1);
      uVar4 = local_3ee0[lVar24 * 4 + 1];
      uVar5 = local_3ee0[lVar24 * 4 + 2];
      uVar6 = *(undefined8 *)(local_3ec0 + lVar24 * 0x20 + -8);
      lVar26 = (long)local_42a4;
      local_3ee0[lVar26 * 4] = local_3ee0[lVar24 * 4];
      local_3ee0[lVar26 * 4 + 1] = uVar4;
      local_3ee0[lVar26 * 4 + 2] = uVar5;
      *(undefined8 *)(local_3ec0 + lVar26 * 0x20 + -8) = uVar6;
    }
    local_2280 = local_42a0._0_8_;
    uStack_2278 = local_42a0._8_8_;
    uStack_2270 = local_42a0._16_8_;
    uStack_2268 = local_42a0._24_8_;
    local_2284 = 0;
    local_d40[0] = 0xffffffff;
    local_d40[1] = 0xffffffff;
    auStack_d38[0] = 0xffffffff;
    auStack_d38[1] = 0xffffffff;
    auStack_d30[0] = 0xffffffff;
    auStack_d30[1] = 0;
    auStack_d28[0] = 0;
    auStack_d28[1] = 0;
    local_d20 = local_42a0._0_8_;
    uStack_d18 = local_42a0._8_8_;
    uStack_d10 = local_42a0._16_8_;
    uStack_d08 = local_42a0._24_8_;
    _local_22c0 = vpand_avx2(local_42a0,(undefined1  [32])sse_bytemask[0]);
    local_9c0 = local_22c0._0_8_;
    uStack_9b8 = local_22c0._8_8_;
    uStack_9b0 = local_22c0._16_8_;
    uStack_9a8 = uStack_22a8;
    uStack_158 = uStack_22a8;
    local_160 = local_22c0._16_8_;
    local_170 = local_22e0._0_8_;
    uStack_168 = local_22e0._8_8_;
    auVar32 = vpaddd_avx(stack0xffffffffffffdd50,local_22e0);
    auVar28 = vpsrldq_avx(auVar32,8);
    local_22d0._0_8_ = auVar32._0_8_;
    local_22d0._8_8_ = auVar32._8_8_;
    local_22e0._0_8_ = auVar28._0_8_;
    local_22e0._8_8_ = auVar28._8_8_;
    local_180 = local_22d0._0_8_;
    uStack_178 = local_22d0._8_8_;
    local_190 = local_22e0._0_8_;
    uStack_188 = local_22e0._8_8_;
    auVar32 = vpaddd_avx(auVar32,auVar28);
    local_22e0 = vpsrldq_avx(auVar32,4);
    local_22d0._0_8_ = auVar32._0_8_;
    local_22d0._8_8_ = auVar32._8_8_;
    local_1a0 = local_22d0._0_8_;
    uStack_198 = local_22d0._8_8_;
    local_1b0 = local_22e0._0_8_;
    uStack_1a8 = local_22e0._8_8_;
    local_22d0 = vpaddd_avx(auVar32,local_22e0);
    local_3e30[(long)local_4208 * 0x20 + (long)local_3ee4] = local_22d0._0_4_;
    local_2300 = local_42a0._0_8_;
    uStack_22f8 = local_42a0._8_8_;
    uStack_22f0 = local_42a0._16_8_;
    uStack_22e8 = local_42a0._24_8_;
    local_2304 = 1;
    local_d00[0] = 0;
    local_d00[1] = 0xffffffff;
    auStack_cf8[0] = 0xffffffff;
    auStack_cf8[1] = 0xffffffff;
    auStack_cf0[0] = 0xffffffff;
    auStack_cf0[1] = 0xffffffff;
    auStack_ce8[0] = 0;
    auStack_ce8[1] = 0;
    local_ce0 = local_42a0._0_8_;
    uStack_cd8 = local_42a0._8_8_;
    uStack_cd0 = local_42a0._16_8_;
    uStack_cc8 = local_42a0._24_8_;
    _local_2340 = vpand_avx2(local_42a0,(undefined1  [32])sse_bytemask[1]);
    local_9a0 = local_2340._0_8_;
    uStack_998 = local_2340._8_8_;
    uStack_990 = local_2340._16_8_;
    uStack_988 = uStack_2328;
    uStack_f8 = uStack_2328;
    local_100 = local_2340._16_8_;
    local_110 = local_2360._0_8_;
    uStack_108 = local_2360._8_8_;
    auVar32 = vpaddd_avx(stack0xffffffffffffdcd0,local_2360);
    auVar28 = vpsrldq_avx(auVar32,8);
    local_2350._0_8_ = auVar32._0_8_;
    local_2350._8_8_ = auVar32._8_8_;
    local_2360._0_8_ = auVar28._0_8_;
    local_2360._8_8_ = auVar28._8_8_;
    local_120 = local_2350._0_8_;
    uStack_118 = local_2350._8_8_;
    local_130 = local_2360._0_8_;
    uStack_128 = local_2360._8_8_;
    auVar32 = vpaddd_avx(auVar32,auVar28);
    local_2360 = vpsrldq_avx(auVar32,4);
    local_2350._0_8_ = auVar32._0_8_;
    local_2350._8_8_ = auVar32._8_8_;
    local_140 = local_2350._0_8_;
    uStack_138 = local_2350._8_8_;
    local_150 = local_2360._0_8_;
    uStack_148 = local_2360._8_8_;
    local_2350 = vpaddd_avx(auVar32,local_2360);
    local_3e30[(long)local_4208 * 0x20 + (long)local_3ee4 + 1] = local_2350._0_4_;
    local_2380 = local_42a0._0_8_;
    uStack_2378 = local_42a0._8_8_;
    uStack_2370 = local_42a0._16_8_;
    uStack_2368 = local_42a0._24_8_;
    local_2384 = 2;
    local_cc0[0] = 0;
    local_cc0[1] = 0;
    auStack_cb8[0] = 0xffffffff;
    auStack_cb8[1] = 0xffffffff;
    auStack_cb0[0] = 0xffffffff;
    auStack_cb0[1] = 0xffffffff;
    auStack_ca8[0] = 0xffffffff;
    auStack_ca8[1] = 0;
    local_ca0 = local_42a0._0_8_;
    uStack_c98 = local_42a0._8_8_;
    uStack_c90 = local_42a0._16_8_;
    uStack_c88 = local_42a0._24_8_;
    _local_23c0 = vpand_avx2(local_42a0,(undefined1  [32])sse_bytemask[2]);
    local_980 = local_23c0._0_8_;
    uStack_978 = local_23c0._8_8_;
    uStack_970 = local_23c0._16_8_;
    uStack_968 = uStack_23a8;
    uStack_98 = uStack_23a8;
    local_a0 = local_23c0._16_8_;
    local_b0 = local_23e0._0_8_;
    uStack_a8 = local_23e0._8_8_;
    auVar32 = vpaddd_avx(stack0xffffffffffffdc50,local_23e0);
    auVar28 = vpsrldq_avx(auVar32,8);
    local_23d0._0_8_ = auVar32._0_8_;
    local_23d0._8_8_ = auVar32._8_8_;
    local_23e0._0_8_ = auVar28._0_8_;
    local_23e0._8_8_ = auVar28._8_8_;
    local_c0 = local_23d0._0_8_;
    uStack_b8 = local_23d0._8_8_;
    local_d0 = local_23e0._0_8_;
    uStack_c8 = local_23e0._8_8_;
    auVar32 = vpaddd_avx(auVar32,auVar28);
    local_23e0 = vpsrldq_avx(auVar32,4);
    local_23d0._0_8_ = auVar32._0_8_;
    local_23d0._8_8_ = auVar32._8_8_;
    local_e0 = local_23d0._0_8_;
    uStack_d8 = local_23d0._8_8_;
    local_f0 = local_23e0._0_8_;
    uStack_e8 = local_23e0._8_8_;
    local_23d0 = vpaddd_avx(auVar32,local_23e0);
    local_3e30[(long)local_4208 * 0x20 + (long)local_3ee4 + 2] = local_23d0._0_4_;
    local_2400 = local_42a0._0_8_;
    uStack_23f8 = local_42a0._8_8_;
    uStack_23f0 = local_42a0._16_8_;
    uStack_23e8 = local_42a0._24_8_;
    local_2404 = 3;
    local_c80[0] = 0;
    local_c80[1] = 0;
    auStack_c78[0] = 0;
    auStack_c78[1] = 0xffffffff;
    auStack_c70[0] = 0xffffffff;
    auStack_c70[1] = 0xffffffff;
    auStack_c68[0] = 0xffffffff;
    auStack_c68[1] = 0xffffffff;
    local_c60 = local_42a0._0_8_;
    uStack_c58 = local_42a0._8_8_;
    uStack_c50 = local_42a0._16_8_;
    uStack_c48 = local_42a0._24_8_;
    _local_2440 = vpand_avx2(local_42a0,(undefined1  [32])sse_bytemask[3]);
    local_960 = local_2440._0_8_;
    uStack_958 = local_2440._8_8_;
    uStack_950 = local_2440._16_8_;
    uStack_948 = uStack_2428;
    uStack_38 = uStack_2428;
    local_40 = local_2440._16_8_;
    local_50 = local_2460._0_8_;
    uStack_48 = local_2460._8_8_;
    auVar32 = vpaddd_avx(stack0xffffffffffffdbd0,local_2460);
    auVar28 = vpsrldq_avx(auVar32,8);
    local_2450._0_8_ = auVar32._0_8_;
    local_2450._8_8_ = auVar32._8_8_;
    local_2460._0_8_ = auVar28._0_8_;
    local_2460._8_8_ = auVar28._8_8_;
    local_60 = local_2450._0_8_;
    uStack_58 = local_2450._8_8_;
    local_70 = local_2460._0_8_;
    uStack_68 = local_2460._8_8_;
    auVar32 = vpaddd_avx(auVar32,auVar28);
    local_2460 = vpsrldq_avx(auVar32,4);
    local_2450._0_8_ = auVar32._0_8_;
    local_2450._8_8_ = auVar32._8_8_;
    local_80 = local_2450._0_8_;
    uStack_78 = local_2450._8_8_;
    local_90 = local_2460._0_8_;
    uStack_88 = local_2460._8_8_;
    local_2450 = vpaddd_avx(auVar32,local_2460);
    local_3e30[(long)local_4208 * 0x20 + (long)(local_3ee4 + 3)] = local_2450._0_4_;
    local_4208 = local_4208 + 1;
  }
  for (local_42f4 = 0; local_42f4 < 4; local_42f4 = local_42f4 + 1) {
    adStack_42d0[local_42f4] =
         (double)*(int *)(in_stack_00000008 + (long)local_42f4 * 4) * local_2e20;
    adStack_42f0[local_42f4] =
         *(double *)(CONCAT44(in_stack_0000003c,bd) + (long)local_42f4 * 8) * local_2e18;
  }
  local_2e10 = in_XMM0_Qa;
  local_2e04 = in_R9D;
  local_2e00 = in_R8D;
  local_2dfc = in_ECX;
  local_2df8 = in_RDX;
  if ((int)d_factor == 0) {
    local_42fc = 0;
    for (local_42f8 = 0; local_42f8 < local_2e04; local_42f8 = local_42f8 + 1) {
      iVar25 = local_2e04 / 2;
      for (local_4304 = 0; local_4304 < local_2e00; local_4304 = local_4304 + 1) {
        uVar1 = *(ushort *)(*local_2df8 + (ulong)(local_42f8 * local_2dfc + local_4304) * 2);
        iVar23 = (uint)(iVar25 <= local_42f8) * 2 + (uint)(local_2e00 / 2 <= local_4304);
        local_4388 = (local_2e28 *
                      (double)(local_3e30[(long)local_42f8 * 0x20 + (long)local_4304] +
                               frame_sse[local_42f8 * 0x20 + local_4304] >>
                              ((char)luma_sse_sum * '\x02' - 0x10U & 0x1f)) * local_2e10 +
                     adStack_42d0[iVar23]) * adStack_42f0[iVar23];
        if (7.0 <= local_4388) {
          local_4388 = 7.0;
        }
        local_1380 = auVar30._0_16_;
        local_1300 = auVar29._0_16_;
        dVar27 = exp(-local_4388);
        *(short *)((long)accumulator + (long)local_42fc * 2) =
             *(short *)((long)accumulator + (long)local_42fc * 2) + (short)(int)(dVar27 * 1000.0);
        subblock_mses[local_42fc] = (int)(dVar27 * 1000.0) * (uint)uVar1 + subblock_mses[local_42fc]
        ;
        local_42fc = local_42fc + 1;
        auVar30._0_16_ = local_1380;
        auVar29._0_16_ = local_1300;
      }
    }
  }
  else {
    local_433c = 0;
    for (local_4338 = 0; local_4338 < local_2e04; local_4338 = local_4338 + 1) {
      iVar25 = local_2e04 / 2;
      for (local_4344 = 0; local_4344 < local_2e00; local_4344 = local_4344 + 1) {
        uVar1 = *(ushort *)(*local_2df8 + (ulong)(local_4338 * local_2dfc + local_4344) * 2);
        iVar23 = (uint)(iVar25 <= local_4338) * 2 + (uint)(local_2e00 / 2 <= local_4344);
        local_4398 = (local_2e28 *
                      (double)(local_3e30[(long)local_4338 * 0x20 + (long)local_4344] +
                               frame_sse[local_4338 * 0x20 + local_4344] >>
                              ((char)luma_sse_sum * '\x02' - 0x10U & 0x1f)) * local_2e10 +
                     adStack_42d0[iVar23]) * adStack_42f0[iVar23];
        if (7.0 <= local_4398) {
          local_4398 = 7.0;
        }
        local_1380 = auVar30._0_16_;
        local_1300 = auVar29._0_16_;
        local_1784 = approx_exp((float)-local_4398);
        local_1784 = local_1784 * 1000.0;
        *(short *)((long)accumulator + (long)local_433c * 2) =
             *(short *)((long)accumulator + (long)local_433c * 2) + (short)(int)(local_1784 + 0.5);
        subblock_mses[local_433c] =
             (int)(local_1784 + 0.5) * (uint)uVar1 + subblock_mses[local_433c];
        local_433c = local_433c + 1;
        auVar30._0_16_ = local_1380;
        auVar29._0_16_ = local_1300;
      }
    }
  }
  return;
}

Assistant:

static void highbd_apply_temporal_filter(
    const uint16_t *frame1, const unsigned int stride, const uint16_t *frame2,
    const unsigned int stride2, const int block_width, const int block_height,
    const int *subblock_mses, unsigned int *accumulator, uint16_t *count,
    uint32_t *frame_sse, uint32_t *luma_sse_sum, int bd,
    const double inv_num_ref_pixels, const double decay_factor,
    const double inv_factor, const double weight_factor, double *d_factor,
    int tf_wgt_calc_lvl) {
  assert(((block_width == 16) || (block_width == 32)) &&
         ((block_height == 16) || (block_height == 32)));

  uint32_t acc_5x5_sse[BH][BW];

  get_squared_error(frame1, stride, frame2, stride2, block_width, block_height,
                    frame_sse, SSE_STRIDE);

  __m128i vsrc[5][2];

  // Traverse 4 columns at a time
  // First and last columns will require padding
  for (int col = 0; col < block_width; col += 4) {
    uint32_t *src = frame_sse + col;

    // Load and pad(for first and last col) 3 rows from the top
    for (int i = 2; i < 5; i++) {
      xx_load_and_pad(src, vsrc[i], col, block_width);
      src += SSE_STRIDE;
    }

    // Padding for top 2 rows
    vsrc[0][0] = vsrc[2][0];
    vsrc[0][1] = vsrc[2][1];
    vsrc[1][0] = vsrc[2][0];
    vsrc[1][1] = vsrc[2][1];

    for (int row = 0; row < block_height - 3; row++) {
      __m128i vsum11 = _mm_add_epi32(vsrc[0][0], vsrc[1][0]);
      __m128i vsum12 = _mm_add_epi32(vsrc[2][0], vsrc[3][0]);
      __m128i vsum13 = _mm_add_epi32(vsum11, vsum12);
      __m128i vsum1 = _mm_add_epi32(vsum13, vsrc[4][0]);

      __m128i vsum21 = _mm_add_epi32(vsrc[0][1], vsrc[1][1]);
      __m128i vsum22 = _mm_add_epi32(vsrc[2][1], vsrc[3][1]);
      __m128i vsum23 = _mm_add_epi32(vsum21, vsum22);
      __m128i vsum2 = _mm_add_epi32(vsum23, vsrc[4][1]);

      vsrc[0][0] = vsrc[1][0];
      vsrc[0][1] = vsrc[1][1];
      vsrc[1][0] = vsrc[2][0];
      vsrc[1][1] = vsrc[2][1];
      vsrc[2][0] = vsrc[3][0];
      vsrc[2][1] = vsrc[3][1];
      vsrc[3][0] = vsrc[4][0];
      vsrc[3][1] = vsrc[4][1];

      // Load next row
      xx_load_and_pad(src, vsrc[4], col, block_width);
      src += SSE_STRIDE;

      acc_5x5_sse[row][col] = xx_mask_and_hadd(vsum1, vsum2, 0);
      acc_5x5_sse[row][col + 1] = xx_mask_and_hadd(vsum1, vsum2, 1);
      acc_5x5_sse[row][col + 2] = xx_mask_and_hadd(vsum1, vsum2, 2);
      acc_5x5_sse[row][col + 3] = xx_mask_and_hadd(vsum1, vsum2, 3);
    }
    for (int row = block_height - 3; row < block_height; row++) {
      __m128i vsum11 = _mm_add_epi32(vsrc[0][0], vsrc[1][0]);
      __m128i vsum12 = _mm_add_epi32(vsrc[2][0], vsrc[3][0]);
      __m128i vsum13 = _mm_add_epi32(vsum11, vsum12);
      __m128i vsum1 = _mm_add_epi32(vsum13, vsrc[4][0]);

      __m128i vsum21 = _mm_add_epi32(vsrc[0][1], vsrc[1][1]);
      __m128i vsum22 = _mm_add_epi32(vsrc[2][1], vsrc[3][1]);
      __m128i vsum23 = _mm_add_epi32(vsum21, vsum22);
      __m128i vsum2 = _mm_add_epi32(vsum23, vsrc[4][1]);

      vsrc[0][0] = vsrc[1][0];
      vsrc[0][1] = vsrc[1][1];
      vsrc[1][0] = vsrc[2][0];
      vsrc[1][1] = vsrc[2][1];
      vsrc[2][0] = vsrc[3][0];
      vsrc[2][1] = vsrc[3][1];
      vsrc[3][0] = vsrc[4][0];
      vsrc[3][1] = vsrc[4][1];

      acc_5x5_sse[row][col] = xx_mask_and_hadd(vsum1, vsum2, 0);
      acc_5x5_sse[row][col + 1] = xx_mask_and_hadd(vsum1, vsum2, 1);
      acc_5x5_sse[row][col + 2] = xx_mask_and_hadd(vsum1, vsum2, 2);
      acc_5x5_sse[row][col + 3] = xx_mask_and_hadd(vsum1, vsum2, 3);
    }
  }

  double subblock_mses_scaled[4];
  double d_factor_decayed[4];
  for (int idx = 0; idx < 4; idx++) {
    subblock_mses_scaled[idx] = subblock_mses[idx] * inv_factor;
    d_factor_decayed[idx] = d_factor[idx] * decay_factor;
  }
  if (tf_wgt_calc_lvl == 0) {
    for (int i = 0, k = 0; i < block_height; i++) {
      const int y_blk_raster_offset = (i >= block_height / 2) * 2;
      for (int j = 0; j < block_width; j++, k++) {
        const int pixel_value = frame2[i * stride2 + j];
        uint32_t diff_sse = acc_5x5_sse[i][j] + luma_sse_sum[i * BW + j];

        // Scale down the difference for high bit depth input.
        diff_sse >>= ((bd - 8) * 2);

        const double window_error = diff_sse * inv_num_ref_pixels;
        const int subblock_idx = y_blk_raster_offset + (j >= block_width / 2);

        const double combined_error =
            weight_factor * window_error + subblock_mses_scaled[subblock_idx];

        double scaled_error = combined_error * d_factor_decayed[subblock_idx];
        scaled_error = AOMMIN(scaled_error, 7);
        const int weight = (int)(exp(-scaled_error) * TF_WEIGHT_SCALE);

        count[k] += weight;
        accumulator[k] += weight * pixel_value;
      }
    }
  } else {
    for (int i = 0, k = 0; i < block_height; i++) {
      const int y_blk_raster_offset = (i >= block_height / 2) * 2;
      for (int j = 0; j < block_width; j++, k++) {
        const int pixel_value = frame2[i * stride2 + j];
        uint32_t diff_sse = acc_5x5_sse[i][j] + luma_sse_sum[i * BW + j];

        // Scale down the difference for high bit depth input.
        diff_sse >>= ((bd - 8) * 2);

        const double window_error = diff_sse * inv_num_ref_pixels;
        const int subblock_idx = y_blk_raster_offset + (j >= block_width / 2);

        const double combined_error =
            weight_factor * window_error + subblock_mses_scaled[subblock_idx];

        double scaled_error = combined_error * d_factor_decayed[subblock_idx];
        scaled_error = AOMMIN(scaled_error, 7);
        const float fweight =
            approx_exp((float)-scaled_error) * TF_WEIGHT_SCALE;
        const int weight = iroundpf(fweight);

        count[k] += weight;
        accumulator[k] += weight * pixel_value;
      }
    }
  }
}